

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase520::run(TestCase520 *this)

{
  PointerType PVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Reader reader;
  Builder root;
  MallocMessageBuilder builder;
  uint local_a2c;
  StructBuilder local_a28;
  ListElementCount local_a00;
  ListReader local_9f8;
  ListBuilder local_9c8;
  PointerBuilder local_998;
  ListElementCount local_974;
  SegmentReader *local_970;
  CapTableReader *pCStack_968;
  byte *local_960;
  undefined8 uStack_958;
  undefined8 local_950;
  int iStack_948;
  undefined4 uStack_944;
  SegmentReader *local_940;
  CapTableReader *pCStack_938;
  byte *local_930;
  undefined8 uStack_928;
  undefined8 local_920;
  int iStack_918;
  undefined4 uStack_914;
  SegmentReader *local_910;
  CapTableReader *pCStack_908;
  byte *local_900;
  undefined8 uStack_8f8;
  undefined8 local_8f0;
  int iStack_8e8;
  undefined4 uStack_8e4;
  SegmentReader *local_8e0;
  CapTableReader *pCStack_8d8;
  byte *local_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  int iStack_8b8;
  undefined4 uStack_8b4;
  SegmentReader *local_8b0;
  CapTableReader *pCStack_8a8;
  byte *local_8a0;
  undefined8 uStack_898;
  undefined8 local_890;
  int iStack_888;
  undefined4 uStack_884;
  SegmentReader *local_880;
  CapTableReader *pCStack_878;
  byte *local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  int iStack_858;
  undefined4 uStack_854;
  SegmentReader *local_850;
  CapTableReader *pCStack_848;
  byte *local_840;
  undefined8 uStack_838;
  undefined8 local_830;
  int iStack_828;
  undefined4 uStack_824;
  SegmentReader *local_820;
  CapTableReader *pCStack_818;
  byte *local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  int iStack_7f8;
  undefined4 uStack_7f4;
  SegmentReader *local_7f0;
  CapTableReader *pCStack_7e8;
  byte *local_7e0;
  undefined8 uStack_7d8;
  undefined8 local_7d0;
  int iStack_7c8;
  undefined4 uStack_7c4;
  SegmentReader *local_7c0;
  CapTableReader *pCStack_7b8;
  byte *local_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  int iStack_798;
  undefined4 uStack_794;
  SegmentReader *local_790;
  CapTableReader *pCStack_788;
  byte *local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  int iStack_768;
  undefined4 uStack_764;
  SegmentReader *local_760;
  CapTableReader *pCStack_758;
  byte *local_750;
  undefined8 uStack_748;
  undefined8 local_740;
  int iStack_738;
  undefined4 uStack_734;
  SegmentReader *local_730;
  CapTableReader *pCStack_728;
  byte *local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  int iStack_708;
  undefined4 uStack_704;
  SegmentReader *local_700;
  CapTableReader *pCStack_6f8;
  byte *local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  int iStack_6d8;
  undefined4 uStack_6d4;
  SegmentReader *local_6d0;
  CapTableReader *pCStack_6c8;
  byte *local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  int iStack_6a8;
  undefined4 uStack_6a4;
  SegmentReader *local_6a0;
  CapTableReader *pCStack_698;
  byte *local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  int iStack_678;
  undefined4 uStack_674;
  SegmentReader *local_670;
  CapTableReader *pCStack_668;
  byte *local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  int iStack_648;
  undefined4 uStack_644;
  SegmentReader *local_640;
  CapTableReader *pCStack_638;
  byte *local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  int iStack_618;
  undefined4 uStack_614;
  SegmentReader *local_610;
  CapTableReader *pCStack_608;
  byte *local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  int iStack_5e8;
  undefined4 uStack_5e4;
  SegmentReader *local_5e0;
  CapTableReader *pCStack_5d8;
  byte *local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  int iStack_5b8;
  undefined4 uStack_5b4;
  SegmentReader *local_5b0;
  CapTableReader *pCStack_5a8;
  byte *local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  int iStack_588;
  undefined4 uStack_584;
  SegmentReader *local_580;
  CapTableReader *pCStack_578;
  byte *local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  int iStack_558;
  undefined4 uStack_554;
  SegmentReader *local_550;
  CapTableReader *pCStack_548;
  byte *local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  int iStack_528;
  undefined4 uStack_524;
  SegmentReader *local_520;
  CapTableReader *pCStack_518;
  byte *local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  int iStack_4f8;
  undefined4 uStack_4f4;
  SegmentReader *local_4f0;
  CapTableReader *pCStack_4e8;
  byte *local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  int iStack_4c8;
  undefined4 uStack_4c4;
  SegmentReader *local_4c0;
  CapTableReader *pCStack_4b8;
  byte *local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  int iStack_498;
  undefined4 uStack_494;
  SegmentReader *local_490;
  CapTableReader *pCStack_488;
  byte *local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  int iStack_468;
  undefined4 uStack_464;
  SegmentReader *local_460;
  CapTableReader *pCStack_458;
  byte *local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  int iStack_438;
  undefined4 uStack_434;
  SegmentReader *local_430;
  CapTableReader *pCStack_428;
  byte *local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  int iStack_408;
  undefined4 uStack_404;
  SegmentReader *local_400;
  CapTableReader *pCStack_3f8;
  byte *local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  int iStack_3d8;
  undefined4 uStack_3d4;
  ListReader local_3d0;
  ListReader local_3a0;
  ListReader local_370;
  ListReader local_340;
  ListReader local_310;
  ListReader local_2e0;
  ListReader local_2b0;
  ListReader local_280;
  ListReader local_250;
  ListReader local_220;
  ListReader local_1f0;
  ListReader local_1c0;
  ListReader local_190;
  ListReader local_160;
  ListReader local_130;
  MallocMessageBuilder local_100;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_100,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_a28,&local_100.super_MessageBuilder);
  local_9f8.ptr = (byte *)local_a28.data;
  PointerBuilder::initStruct
            ((StructBuilder *)&local_9c8,(PointerBuilder *)&local_9f8,(StructSize)0x140006);
  StructBuilder::asReader((StructBuilder *)&local_9c8);
  local_9f8.ptr = (byte *)(local_a28.pointers + 3);
  if (local_a28.pointerCount < 4) {
    local_9f8.ptr = (byte *)(WirePointer *)0x0;
  }
  uVar2 = local_a28.segment._0_4_;
  uVar3 = local_a28.segment._4_4_;
  uVar4 = local_a28.capTable._0_4_;
  uVar5 = local_a28.capTable._4_4_;
  local_9f8.elementCount = local_a00;
  if (local_a28.pointerCount < 4) {
    uVar2 = 0;
    uVar3 = 0;
    uVar4 = 0;
    uVar5 = 0;
    local_9f8.elementCount = 0x7fffffff;
  }
  local_9f8.segment = (SegmentReader *)CONCAT44(uVar3,uVar2);
  local_9f8.capTable = (CapTableReader *)CONCAT44(uVar5,uVar4);
  PointerReader::getList(&local_130,(PointerReader *)&local_9f8,VOID,(word *)0x0);
  local_9f8._32_6_ = local_130._32_6_;
  local_9f8.elementSize = local_130.elementSize;
  local_9f8._39_1_ = local_130._39_1_;
  local_9f8.nestingLimit = local_130.nestingLimit;
  local_9f8._44_4_ = local_130._44_4_;
  local_9f8.ptr = local_130.ptr;
  local_9f8.elementCount = local_130.elementCount;
  local_9f8.step._0_2_ = (undefined2)local_130.step;
  local_9f8.step._2_1_ = local_130.step._2_1_;
  local_9f8.step._3_1_ = local_130.step._3_1_;
  local_9f8.segment = local_130.segment;
  local_9f8.capTable = local_130.capTable;
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x18);
  local_998.segment = local_9c8.segment;
  local_998.capTable = local_9c8.capTable;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9f8.ptr = (byte *)(local_a28.pointers + 4);
  if (local_a28.pointerCount < 5) {
    local_9f8.ptr = (byte *)(WirePointer *)0x0;
  }
  uVar2 = local_a28.segment._0_4_;
  uVar3 = local_a28.segment._4_4_;
  uVar4 = local_a28.capTable._0_4_;
  uVar5 = local_a28.capTable._4_4_;
  local_9f8.elementCount = local_a00;
  if (local_a28.pointerCount < 5) {
    uVar2 = 0;
    uVar3 = 0;
    uVar4 = 0;
    uVar5 = 0;
    local_9f8.elementCount = 0x7fffffff;
  }
  local_9f8.segment = (SegmentReader *)CONCAT44(uVar3,uVar2);
  local_9f8.capTable = (CapTableReader *)CONCAT44(uVar5,uVar4);
  PointerReader::getList(&local_160,(PointerReader *)&local_9f8,BIT,(word *)0x0);
  local_9f8._32_6_ = local_160._32_6_;
  local_9f8.elementSize = local_160.elementSize;
  local_9f8._39_1_ = local_160._39_1_;
  local_9f8.nestingLimit = local_160.nestingLimit;
  local_9f8._44_4_ = local_160._44_4_;
  local_9f8.ptr = local_160.ptr;
  local_9f8.elementCount = local_160.elementCount;
  local_9f8.step._0_2_ = (undefined2)local_160.step;
  local_9f8.step._2_1_ = local_160.step._2_1_;
  local_9f8.step._3_1_ = local_160.step._3_1_;
  local_9f8.segment = local_160.segment;
  local_9f8.capTable = local_160.capTable;
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x20);
  local_998.segment = local_9c8.segment;
  local_998.capTable = local_9c8.capTable;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9f8.ptr = (byte *)(local_a28.pointers + 9);
  if (local_a28.pointerCount < 10) {
    local_9f8.ptr = (byte *)(WirePointer *)0x0;
  }
  uVar2 = local_a28.segment._0_4_;
  uVar3 = local_a28.segment._4_4_;
  uVar4 = local_a28.capTable._0_4_;
  uVar5 = local_a28.capTable._4_4_;
  local_9f8.elementCount = local_a00;
  if (local_a28.pointerCount < 10) {
    uVar2 = 0;
    uVar3 = 0;
    uVar4 = 0;
    uVar5 = 0;
    local_9f8.elementCount = 0x7fffffff;
  }
  local_9f8.segment = (SegmentReader *)CONCAT44(uVar3,uVar2);
  local_9f8.capTable = (CapTableReader *)CONCAT44(uVar5,uVar4);
  PointerReader::getList(&local_190,(PointerReader *)&local_9f8,BYTE,(word *)0x0);
  local_9f8._32_6_ = local_190._32_6_;
  local_9f8.elementSize = local_190.elementSize;
  local_9f8._39_1_ = local_190._39_1_;
  local_9f8.nestingLimit = local_190.nestingLimit;
  local_9f8._44_4_ = local_190._44_4_;
  local_9f8.ptr = local_190.ptr;
  local_9f8.elementCount = local_190.elementCount;
  local_9f8.step._0_2_ = (undefined2)local_190.step;
  local_9f8.step._2_1_ = local_190.step._2_1_;
  local_9f8.step._3_1_ = local_190.step._3_1_;
  local_9f8.segment = local_190.segment;
  local_9f8.capTable = local_190.capTable;
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x48);
  local_998.segment = local_9c8.segment;
  local_998.capTable = local_9c8.capTable;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9f8.ptr = (byte *)(local_a28.pointers + 10);
  if (local_a28.pointerCount < 0xb) {
    local_9f8.ptr = (byte *)(WirePointer *)0x0;
  }
  uVar2 = local_a28.segment._0_4_;
  uVar3 = local_a28.segment._4_4_;
  uVar4 = local_a28.capTable._0_4_;
  uVar5 = local_a28.capTable._4_4_;
  local_9f8.elementCount = local_a00;
  if (local_a28.pointerCount < 0xb) {
    uVar2 = 0;
    uVar3 = 0;
    uVar4 = 0;
    uVar5 = 0;
    local_9f8.elementCount = 0x7fffffff;
  }
  local_9f8.segment = (SegmentReader *)CONCAT44(uVar3,uVar2);
  local_9f8.capTable = (CapTableReader *)CONCAT44(uVar5,uVar4);
  PointerReader::getList(&local_1c0,(PointerReader *)&local_9f8,TWO_BYTES,(word *)0x0);
  local_9f8._32_6_ = local_1c0._32_6_;
  local_9f8.elementSize = local_1c0.elementSize;
  local_9f8._39_1_ = local_1c0._39_1_;
  local_9f8.nestingLimit = local_1c0.nestingLimit;
  local_9f8._44_4_ = local_1c0._44_4_;
  local_9f8.ptr = local_1c0.ptr;
  local_9f8.elementCount = local_1c0.elementCount;
  local_9f8.step._0_2_ = (undefined2)local_1c0.step;
  local_9f8.step._2_1_ = local_1c0.step._2_1_;
  local_9f8.step._3_1_ = local_1c0.step._3_1_;
  local_9f8.segment = local_1c0.segment;
  local_9f8.capTable = local_1c0.capTable;
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x50);
  local_998.segment = local_9c8.segment;
  local_998.capTable = local_9c8.capTable;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9f8.ptr = (byte *)(local_a28.pointers + 0xb);
  if (local_a28.pointerCount < 0xc) {
    local_9f8.ptr = (byte *)(WirePointer *)0x0;
  }
  uVar2 = local_a28.segment._0_4_;
  uVar3 = local_a28.segment._4_4_;
  uVar4 = local_a28.capTable._0_4_;
  uVar5 = local_a28.capTable._4_4_;
  local_9f8.elementCount = local_a00;
  if (local_a28.pointerCount < 0xc) {
    uVar2 = 0;
    uVar3 = 0;
    uVar4 = 0;
    uVar5 = 0;
    local_9f8.elementCount = 0x7fffffff;
  }
  local_9f8.segment = (SegmentReader *)CONCAT44(uVar3,uVar2);
  local_9f8.capTable = (CapTableReader *)CONCAT44(uVar5,uVar4);
  PointerReader::getList(&local_1f0,(PointerReader *)&local_9f8,FOUR_BYTES,(word *)0x0);
  local_9f8._32_6_ = local_1f0._32_6_;
  local_9f8.elementSize = local_1f0.elementSize;
  local_9f8._39_1_ = local_1f0._39_1_;
  local_9f8.nestingLimit = local_1f0.nestingLimit;
  local_9f8._44_4_ = local_1f0._44_4_;
  local_9f8.ptr = local_1f0.ptr;
  local_9f8.elementCount = local_1f0.elementCount;
  local_9f8.step._0_2_ = (undefined2)local_1f0.step;
  local_9f8.step._2_1_ = local_1f0.step._2_1_;
  local_9f8.step._3_1_ = local_1f0.step._3_1_;
  local_9f8.segment = local_1f0.segment;
  local_9f8.capTable = local_1f0.capTable;
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x58);
  local_998.segment = local_9c8.segment;
  local_998.capTable = local_9c8.capTable;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9f8.ptr = (byte *)(local_a28.pointers + 0xc);
  if (local_a28.pointerCount < 0xd) {
    local_9f8.ptr = (byte *)(WirePointer *)0x0;
  }
  uVar2 = local_a28.segment._0_4_;
  uVar3 = local_a28.segment._4_4_;
  uVar4 = local_a28.capTable._0_4_;
  uVar5 = local_a28.capTable._4_4_;
  local_9f8.elementCount = local_a00;
  if (local_a28.pointerCount < 0xd) {
    uVar2 = 0;
    uVar3 = 0;
    uVar4 = 0;
    uVar5 = 0;
    local_9f8.elementCount = 0x7fffffff;
  }
  local_9f8.segment = (SegmentReader *)CONCAT44(uVar3,uVar2);
  local_9f8.capTable = (CapTableReader *)CONCAT44(uVar5,uVar4);
  PointerReader::getList(&local_220,(PointerReader *)&local_9f8,EIGHT_BYTES,(word *)0x0);
  local_9f8._32_6_ = local_220._32_6_;
  local_9f8.elementSize = local_220.elementSize;
  local_9f8._39_1_ = local_220._39_1_;
  local_9f8.nestingLimit = local_220.nestingLimit;
  local_9f8._44_4_ = local_220._44_4_;
  local_9f8.ptr = local_220.ptr;
  local_9f8.elementCount = local_220.elementCount;
  local_9f8.step._0_2_ = (undefined2)local_220.step;
  local_9f8.step._2_1_ = local_220.step._2_1_;
  local_9f8.step._3_1_ = local_220.step._3_1_;
  local_9f8.segment = local_220.segment;
  local_9f8.capTable = local_220.capTable;
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x60);
  local_998.segment = local_9c8.segment;
  local_998.capTable = local_9c8.capTable;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9f8.ptr = (byte *)(local_a28.pointers + 5);
  if (local_a28.pointerCount < 6) {
    local_9f8.ptr = (byte *)(WirePointer *)0x0;
  }
  uVar2 = local_a28.segment._0_4_;
  uVar3 = local_a28.segment._4_4_;
  uVar4 = local_a28.capTable._0_4_;
  uVar5 = local_a28.capTable._4_4_;
  local_9f8.elementCount = local_a00;
  if (local_a28.pointerCount < 6) {
    uVar2 = 0;
    uVar3 = 0;
    uVar4 = 0;
    uVar5 = 0;
    local_9f8.elementCount = 0x7fffffff;
  }
  local_9f8.segment = (SegmentReader *)CONCAT44(uVar3,uVar2);
  local_9f8.capTable = (CapTableReader *)CONCAT44(uVar5,uVar4);
  PointerReader::getList(&local_250,(PointerReader *)&local_9f8,BYTE,(word *)0x0);
  local_9f8._32_6_ = local_250._32_6_;
  local_9f8.elementSize = local_250.elementSize;
  local_9f8._39_1_ = local_250._39_1_;
  local_9f8.nestingLimit = local_250.nestingLimit;
  local_9f8._44_4_ = local_250._44_4_;
  local_9f8.ptr = local_250.ptr;
  local_9f8.elementCount = local_250.elementCount;
  local_9f8.step._0_2_ = (undefined2)local_250.step;
  local_9f8.step._2_1_ = local_250.step._2_1_;
  local_9f8.step._3_1_ = local_250.step._3_1_;
  local_9f8.segment = local_250.segment;
  local_9f8.capTable = local_250.capTable;
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x28);
  local_998.segment = local_9c8.segment;
  local_998.capTable = local_9c8.capTable;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9f8.ptr = (byte *)(local_a28.pointers + 6);
  if (local_a28.pointerCount < 7) {
    local_9f8.ptr = (byte *)(WirePointer *)0x0;
  }
  uVar2 = local_a28.segment._0_4_;
  uVar3 = local_a28.segment._4_4_;
  uVar4 = local_a28.capTable._0_4_;
  uVar5 = local_a28.capTable._4_4_;
  local_9f8.elementCount = local_a00;
  if (local_a28.pointerCount < 7) {
    uVar2 = 0;
    uVar3 = 0;
    uVar4 = 0;
    uVar5 = 0;
    local_9f8.elementCount = 0x7fffffff;
  }
  local_9f8.segment = (SegmentReader *)CONCAT44(uVar3,uVar2);
  local_9f8.capTable = (CapTableReader *)CONCAT44(uVar5,uVar4);
  PointerReader::getList(&local_280,(PointerReader *)&local_9f8,TWO_BYTES,(word *)0x0);
  local_9f8._32_6_ = local_280._32_6_;
  local_9f8.elementSize = local_280.elementSize;
  local_9f8._39_1_ = local_280._39_1_;
  local_9f8.nestingLimit = local_280.nestingLimit;
  local_9f8._44_4_ = local_280._44_4_;
  local_9f8.ptr = local_280.ptr;
  local_9f8.elementCount = local_280.elementCount;
  local_9f8.step._0_2_ = (undefined2)local_280.step;
  local_9f8.step._2_1_ = local_280.step._2_1_;
  local_9f8.step._3_1_ = local_280.step._3_1_;
  local_9f8.segment = local_280.segment;
  local_9f8.capTable = local_280.capTable;
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x30);
  local_998.segment = local_9c8.segment;
  local_998.capTable = local_9c8.capTable;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9f8.ptr = (byte *)(local_a28.pointers + 7);
  if (local_a28.pointerCount < 8) {
    local_9f8.ptr = (byte *)(WirePointer *)0x0;
  }
  uVar2 = local_a28.segment._0_4_;
  uVar3 = local_a28.segment._4_4_;
  uVar4 = local_a28.capTable._0_4_;
  uVar5 = local_a28.capTable._4_4_;
  local_9f8.elementCount = local_a00;
  if (local_a28.pointerCount < 8) {
    uVar2 = 0;
    uVar3 = 0;
    uVar4 = 0;
    uVar5 = 0;
    local_9f8.elementCount = 0x7fffffff;
  }
  local_9f8.segment = (SegmentReader *)CONCAT44(uVar3,uVar2);
  local_9f8.capTable = (CapTableReader *)CONCAT44(uVar5,uVar4);
  PointerReader::getList(&local_2b0,(PointerReader *)&local_9f8,FOUR_BYTES,(word *)0x0);
  local_9f8._32_6_ = local_2b0._32_6_;
  local_9f8.elementSize = local_2b0.elementSize;
  local_9f8._39_1_ = local_2b0._39_1_;
  local_9f8.nestingLimit = local_2b0.nestingLimit;
  local_9f8._44_4_ = local_2b0._44_4_;
  local_9f8.ptr = local_2b0.ptr;
  local_9f8.elementCount = local_2b0.elementCount;
  local_9f8.step._0_2_ = (undefined2)local_2b0.step;
  local_9f8.step._2_1_ = local_2b0.step._2_1_;
  local_9f8.step._3_1_ = local_2b0.step._3_1_;
  local_9f8.segment = local_2b0.segment;
  local_9f8.capTable = local_2b0.capTable;
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x38);
  local_998.segment = local_9c8.segment;
  local_998.capTable = local_9c8.capTable;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9f8.ptr = (byte *)(local_a28.pointers + 8);
  if (local_a28.pointerCount < 9) {
    local_9f8.ptr = (byte *)(WirePointer *)0x0;
  }
  uVar2 = local_a28.segment._0_4_;
  uVar3 = local_a28.segment._4_4_;
  uVar4 = local_a28.capTable._0_4_;
  uVar5 = local_a28.capTable._4_4_;
  local_9f8.elementCount = local_a00;
  if (local_a28.pointerCount < 9) {
    uVar2 = 0;
    uVar3 = 0;
    uVar4 = 0;
    uVar5 = 0;
    local_9f8.elementCount = 0x7fffffff;
  }
  local_9f8.segment = (SegmentReader *)CONCAT44(uVar3,uVar2);
  local_9f8.capTable = (CapTableReader *)CONCAT44(uVar5,uVar4);
  PointerReader::getList(&local_2e0,(PointerReader *)&local_9f8,EIGHT_BYTES,(word *)0x0);
  local_9f8._32_6_ = local_2e0._32_6_;
  local_9f8.elementSize = local_2e0.elementSize;
  local_9f8._39_1_ = local_2e0._39_1_;
  local_9f8.nestingLimit = local_2e0.nestingLimit;
  local_9f8._44_4_ = local_2e0._44_4_;
  local_9f8.ptr = local_2e0.ptr;
  local_9f8.elementCount = local_2e0.elementCount;
  local_9f8.step._0_2_ = (undefined2)local_2e0.step;
  local_9f8.step._2_1_ = local_2e0.step._2_1_;
  local_9f8.step._3_1_ = local_2e0.step._3_1_;
  local_9f8.segment = local_2e0.segment;
  local_9f8.capTable = local_2e0.capTable;
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x40);
  local_998.segment = local_9c8.segment;
  local_998.capTable = local_9c8.capTable;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9f8.ptr = (byte *)(local_a28.pointers + 0xd);
  if (local_a28.pointerCount < 0xe) {
    local_9f8.ptr = (byte *)(WirePointer *)0x0;
  }
  uVar2 = local_a28.segment._0_4_;
  uVar3 = local_a28.segment._4_4_;
  uVar4 = local_a28.capTable._0_4_;
  uVar5 = local_a28.capTable._4_4_;
  local_9f8.elementCount = local_a00;
  if (local_a28.pointerCount < 0xe) {
    uVar2 = 0;
    uVar3 = 0;
    uVar4 = 0;
    uVar5 = 0;
    local_9f8.elementCount = 0x7fffffff;
  }
  local_9f8.segment = (SegmentReader *)CONCAT44(uVar3,uVar2);
  local_9f8.capTable = (CapTableReader *)CONCAT44(uVar5,uVar4);
  PointerReader::getList(&local_310,(PointerReader *)&local_9f8,FOUR_BYTES,(word *)0x0);
  local_9f8._32_6_ = local_310._32_6_;
  local_9f8.elementSize = local_310.elementSize;
  local_9f8._39_1_ = local_310._39_1_;
  local_9f8.nestingLimit = local_310.nestingLimit;
  local_9f8._44_4_ = local_310._44_4_;
  local_9f8.ptr = local_310.ptr;
  local_9f8.elementCount = local_310.elementCount;
  local_9f8.step._0_2_ = (undefined2)local_310.step;
  local_9f8.step._2_1_ = local_310.step._2_1_;
  local_9f8.step._3_1_ = local_310.step._3_1_;
  local_9f8.segment = local_310.segment;
  local_9f8.capTable = local_310.capTable;
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x68);
  local_998.segment = local_9c8.segment;
  local_998.capTable = local_9c8.capTable;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9f8.ptr = (byte *)(local_a28.pointers + 0xe);
  if (local_a28.pointerCount < 0xf) {
    local_9f8.ptr = (byte *)(WirePointer *)0x0;
  }
  uVar2 = local_a28.segment._0_4_;
  uVar3 = local_a28.segment._4_4_;
  uVar4 = local_a28.capTable._0_4_;
  uVar5 = local_a28.capTable._4_4_;
  local_9f8.elementCount = local_a00;
  if (local_a28.pointerCount < 0xf) {
    uVar2 = 0;
    uVar3 = 0;
    uVar4 = 0;
    uVar5 = 0;
    local_9f8.elementCount = 0x7fffffff;
  }
  local_9f8.segment = (SegmentReader *)CONCAT44(uVar3,uVar2);
  local_9f8.capTable = (CapTableReader *)CONCAT44(uVar5,uVar4);
  PointerReader::getList(&local_340,(PointerReader *)&local_9f8,EIGHT_BYTES,(word *)0x0);
  local_9f8._32_6_ = local_340._32_6_;
  local_9f8.elementSize = local_340.elementSize;
  local_9f8._39_1_ = local_340._39_1_;
  local_9f8.nestingLimit = local_340.nestingLimit;
  local_9f8._44_4_ = local_340._44_4_;
  local_9f8.ptr = local_340.ptr;
  local_9f8.elementCount = local_340.elementCount;
  local_9f8.step._0_2_ = (undefined2)local_340.step;
  local_9f8.step._2_1_ = local_340.step._2_1_;
  local_9f8.step._3_1_ = local_340.step._3_1_;
  local_9f8.segment = local_340.segment;
  local_9f8.capTable = local_340.capTable;
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x70);
  local_998.segment = local_9c8.segment;
  local_998.capTable = local_9c8.capTable;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9f8.ptr = (byte *)(local_a28.pointers + 0xf);
  if (local_a28.pointerCount < 0x10) {
    local_9f8.ptr = (byte *)(WirePointer *)0x0;
  }
  uVar2 = local_a28.segment._0_4_;
  uVar3 = local_a28.segment._4_4_;
  uVar4 = local_a28.capTable._0_4_;
  uVar5 = local_a28.capTable._4_4_;
  local_9f8.elementCount = local_a00;
  if (local_a28.pointerCount < 0x10) {
    uVar2 = 0;
    uVar3 = 0;
    uVar4 = 0;
    uVar5 = 0;
    local_9f8.elementCount = 0x7fffffff;
  }
  local_9f8.segment = (SegmentReader *)CONCAT44(uVar3,uVar2);
  local_9f8.capTable = (CapTableReader *)CONCAT44(uVar5,uVar4);
  PointerReader::getList(&local_370,(PointerReader *)&local_9f8,POINTER,(word *)0x0);
  local_9f8._32_6_ = local_370._32_6_;
  local_9f8.elementSize = local_370.elementSize;
  local_9f8._39_1_ = local_370._39_1_;
  local_9f8.nestingLimit = local_370.nestingLimit;
  local_9f8._44_4_ = local_370._44_4_;
  local_9f8.ptr = local_370.ptr;
  local_9f8.elementCount = local_370.elementCount;
  local_9f8.step._0_2_ = (undefined2)local_370.step;
  local_9f8.step._2_1_ = local_370.step._2_1_;
  local_9f8.step._3_1_ = local_370.step._3_1_;
  local_9f8.segment = local_370.segment;
  local_9f8.capTable = local_370.capTable;
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x78);
  local_998.segment = local_9c8.segment;
  local_998.capTable = local_9c8.capTable;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9f8.ptr = (byte *)(local_a28.pointers + 0x10);
  if (local_a28.pointerCount < 0x11) {
    local_9f8.ptr = (byte *)(WirePointer *)0x0;
  }
  uVar2 = local_a28.segment._0_4_;
  uVar3 = local_a28.segment._4_4_;
  uVar4 = local_a28.capTable._0_4_;
  uVar5 = local_a28.capTable._4_4_;
  local_9f8.elementCount = local_a00;
  if (local_a28.pointerCount < 0x11) {
    uVar2 = 0;
    uVar3 = 0;
    uVar4 = 0;
    uVar5 = 0;
    local_9f8.elementCount = 0x7fffffff;
  }
  local_9f8.segment = (SegmentReader *)CONCAT44(uVar3,uVar2);
  local_9f8.capTable = (CapTableReader *)CONCAT44(uVar5,uVar4);
  PointerReader::getList(&local_3a0,(PointerReader *)&local_9f8,POINTER,(word *)0x0);
  local_9f8._32_6_ = local_3a0._32_6_;
  local_9f8.elementSize = local_3a0.elementSize;
  local_9f8._39_1_ = local_3a0._39_1_;
  local_9f8.nestingLimit = local_3a0.nestingLimit;
  local_9f8._44_4_ = local_3a0._44_4_;
  local_9f8.ptr = local_3a0.ptr;
  local_9f8.elementCount = local_3a0.elementCount;
  local_9f8.step._0_2_ = (undefined2)local_3a0.step;
  local_9f8.step._2_1_ = local_3a0.step._2_1_;
  local_9f8.step._3_1_ = local_3a0.step._3_1_;
  local_9f8.segment = local_3a0.segment;
  local_9f8.capTable = local_3a0.capTable;
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x80);
  local_998.segment = local_9c8.segment;
  local_998.capTable = local_9c8.capTable;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9f8.ptr = (byte *)(local_a28.pointers + 0x11);
  if (local_a28.pointerCount < 0x12) {
    local_9f8.ptr = (byte *)(WirePointer *)0x0;
  }
  uVar2 = local_a28.segment._0_4_;
  uVar3 = local_a28.segment._4_4_;
  uVar4 = local_a28.capTable._0_4_;
  uVar5 = local_a28.capTable._4_4_;
  if (local_a28.pointerCount < 0x12) {
    uVar2 = 0;
    uVar3 = 0;
    uVar4 = 0;
    uVar5 = 0;
    local_a00 = 0x7fffffff;
  }
  local_9f8.segment = (SegmentReader *)CONCAT44(uVar3,uVar2);
  local_9f8.capTable = (CapTableReader *)CONCAT44(uVar5,uVar4);
  local_9f8.elementCount = local_a00;
  PointerReader::getList(&local_3d0,(PointerReader *)&local_9f8,INLINE_COMPOSITE,(word *)0x0);
  local_9f8._32_6_ = local_3d0._32_6_;
  local_9f8.elementSize = local_3d0.elementSize;
  local_9f8._39_1_ = local_3d0._39_1_;
  local_9f8.nestingLimit = local_3d0.nestingLimit;
  local_9f8._44_4_ = local_3d0._44_4_;
  local_9f8.ptr = local_3d0.ptr;
  local_9f8.elementCount = local_3d0.elementCount;
  local_9f8.step._0_2_ = (undefined2)local_3d0.step;
  local_9f8.step._2_1_ = local_3d0.step._2_1_;
  local_9f8.step._3_1_ = local_3d0.step._3_1_;
  local_9f8.segment = local_3d0.segment;
  local_9f8.capTable = local_3d0.capTable;
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x88);
  local_998.segment = local_9c8.segment;
  local_998.capTable = local_9c8.capTable;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9f8.ptr =
       (byte *)(CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) +
               0x18);
  local_9f8.segment = &(local_9c8.segment)->super_SegmentReader;
  local_9f8.capTable = &(local_9c8.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasVoidList()\"",
               (char (*) [36])"failed: expected root.hasVoidList()");
  }
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x18);
  local_998.segment = local_9c8.segment;
  local_998.capTable = local_9c8.capTable;
  PointerBuilder::getList((ListBuilder *)&local_9f8,&local_998,VOID,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_a2c = 0;
    local_998.pointer =
         (WirePointer *)
         (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x18);
    local_998.segment = local_9c8.segment;
    local_998.capTable = local_9c8.capTable;
    PointerBuilder::getList((ListBuilder *)&local_9f8,&local_998,VOID,(word *)0x0);
    local_974 = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getVoidList().size())\", 0, root.getVoidList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getVoidList().size())",
               (int *)&local_a2c,&local_974);
  }
  local_9f8.ptr =
       (byte *)(CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) +
               0x20);
  local_9f8.segment = &(local_9c8.segment)->super_SegmentReader;
  local_9f8.capTable = &(local_9c8.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasBoolList()\"",
               (char (*) [36])"failed: expected root.hasBoolList()");
  }
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x20);
  local_998.segment = local_9c8.segment;
  local_998.capTable = local_9c8.capTable;
  PointerBuilder::getList((ListBuilder *)&local_9f8,&local_998,BIT,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_a2c = 0;
    local_998.pointer =
         (WirePointer *)
         (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x20);
    local_998.segment = local_9c8.segment;
    local_998.capTable = local_9c8.capTable;
    PointerBuilder::getList((ListBuilder *)&local_9f8,&local_998,BIT,(word *)0x0);
    local_974 = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getBoolList().size())\", 0, root.getBoolList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getBoolList().size())",
               (int *)&local_a2c,&local_974);
  }
  local_9f8.ptr =
       (byte *)(CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) +
               0x48);
  local_9f8.segment = &(local_9c8.segment)->super_SegmentReader;
  local_9f8.capTable = &(local_9c8.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasUInt8List()\"",
               (char (*) [37])"failed: expected root.hasUInt8List()");
  }
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x48);
  local_998.segment = local_9c8.segment;
  local_998.capTable = local_9c8.capTable;
  PointerBuilder::getList((ListBuilder *)&local_9f8,&local_998,BYTE,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_a2c = 0;
    local_998.pointer =
         (WirePointer *)
         (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x48);
    local_998.segment = local_9c8.segment;
    local_998.capTable = local_9c8.capTable;
    PointerBuilder::getList((ListBuilder *)&local_9f8,&local_998,BYTE,(word *)0x0);
    local_974 = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt8List().size())\", 0, root.getUInt8List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getUInt8List().size())",
               (int *)&local_a2c,&local_974);
  }
  local_9f8.ptr =
       (byte *)(CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) +
               0x50);
  local_9f8.segment = &(local_9c8.segment)->super_SegmentReader;
  local_9f8.capTable = &(local_9c8.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasUInt16List()\"",
               (char (*) [38])"failed: expected root.hasUInt16List()");
  }
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x50);
  local_998.segment = local_9c8.segment;
  local_998.capTable = local_9c8.capTable;
  PointerBuilder::getList((ListBuilder *)&local_9f8,&local_998,TWO_BYTES,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_a2c = 0;
    local_998.pointer =
         (WirePointer *)
         (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x50);
    local_998.segment = local_9c8.segment;
    local_998.capTable = local_9c8.capTable;
    PointerBuilder::getList((ListBuilder *)&local_9f8,&local_998,TWO_BYTES,(word *)0x0);
    local_974 = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt16List().size())\", 0, root.getUInt16List().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getUInt16List().size())",
               (int *)&local_a2c,&local_974);
  }
  local_9f8.ptr =
       (byte *)(CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) +
               0x58);
  local_9f8.segment = &(local_9c8.segment)->super_SegmentReader;
  local_9f8.capTable = &(local_9c8.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasUInt32List()\"",
               (char (*) [38])"failed: expected root.hasUInt32List()");
  }
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x58);
  local_998.segment = local_9c8.segment;
  local_998.capTable = local_9c8.capTable;
  PointerBuilder::getList((ListBuilder *)&local_9f8,&local_998,FOUR_BYTES,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_a2c = 0;
    local_998.pointer =
         (WirePointer *)
         (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x58);
    local_998.segment = local_9c8.segment;
    local_998.capTable = local_9c8.capTable;
    PointerBuilder::getList((ListBuilder *)&local_9f8,&local_998,FOUR_BYTES,(word *)0x0);
    local_974 = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt32List().size())\", 0, root.getUInt32List().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getUInt32List().size())",
               (int *)&local_a2c,&local_974);
  }
  local_9f8.ptr =
       (byte *)(CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) +
               0x60);
  local_9f8.segment = &(local_9c8.segment)->super_SegmentReader;
  local_9f8.capTable = &(local_9c8.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasUInt64List()\"",
               (char (*) [38])"failed: expected root.hasUInt64List()");
  }
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x60);
  local_998.segment = local_9c8.segment;
  local_998.capTable = local_9c8.capTable;
  PointerBuilder::getList((ListBuilder *)&local_9f8,&local_998,EIGHT_BYTES,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_a2c = 0;
    local_998.pointer =
         (WirePointer *)
         (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x60);
    local_998.segment = local_9c8.segment;
    local_998.capTable = local_9c8.capTable;
    PointerBuilder::getList((ListBuilder *)&local_9f8,&local_998,EIGHT_BYTES,(word *)0x0);
    local_974 = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt64List().size())\", 0, root.getUInt64List().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getUInt64List().size())",
               (int *)&local_a2c,&local_974);
  }
  local_9f8.ptr =
       (byte *)(CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) +
               0x28);
  local_9f8.segment = &(local_9c8.segment)->super_SegmentReader;
  local_9f8.capTable = &(local_9c8.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasInt8List()\"",
               (char (*) [36])"failed: expected root.hasInt8List()");
  }
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x28);
  local_998.segment = local_9c8.segment;
  local_998.capTable = local_9c8.capTable;
  PointerBuilder::getList((ListBuilder *)&local_9f8,&local_998,BYTE,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_a2c = 0;
    local_998.pointer =
         (WirePointer *)
         (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x28);
    local_998.segment = local_9c8.segment;
    local_998.capTable = local_9c8.capTable;
    PointerBuilder::getList((ListBuilder *)&local_9f8,&local_998,BYTE,(word *)0x0);
    local_974 = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt8List().size())\", 0, root.getInt8List().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getInt8List().size())",
               (int *)&local_a2c,&local_974);
  }
  local_9f8.ptr =
       (byte *)(CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) +
               0x30);
  local_9f8.segment = &(local_9c8.segment)->super_SegmentReader;
  local_9f8.capTable = &(local_9c8.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasInt16List()\"",
               (char (*) [37])"failed: expected root.hasInt16List()");
  }
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x30);
  local_998.segment = local_9c8.segment;
  local_998.capTable = local_9c8.capTable;
  PointerBuilder::getList((ListBuilder *)&local_9f8,&local_998,TWO_BYTES,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_a2c = 0;
    local_998.pointer =
         (WirePointer *)
         (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x30);
    local_998.segment = local_9c8.segment;
    local_998.capTable = local_9c8.capTable;
    PointerBuilder::getList((ListBuilder *)&local_9f8,&local_998,TWO_BYTES,(word *)0x0);
    local_974 = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt16List().size())\", 0, root.getInt16List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getInt16List().size())",
               (int *)&local_a2c,&local_974);
  }
  local_9f8.ptr =
       (byte *)(CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) +
               0x38);
  local_9f8.segment = &(local_9c8.segment)->super_SegmentReader;
  local_9f8.capTable = &(local_9c8.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasInt32List()\"",
               (char (*) [37])"failed: expected root.hasInt32List()");
  }
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x38);
  local_998.segment = local_9c8.segment;
  local_998.capTable = local_9c8.capTable;
  PointerBuilder::getList((ListBuilder *)&local_9f8,&local_998,FOUR_BYTES,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_a2c = 0;
    local_998.pointer =
         (WirePointer *)
         (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x38);
    local_998.segment = local_9c8.segment;
    local_998.capTable = local_9c8.capTable;
    PointerBuilder::getList((ListBuilder *)&local_9f8,&local_998,FOUR_BYTES,(word *)0x0);
    local_974 = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt32List().size())\", 0, root.getInt32List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getInt32List().size())",
               (int *)&local_a2c,&local_974);
  }
  local_9f8.ptr =
       (byte *)(CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) +
               0x40);
  local_9f8.segment = &(local_9c8.segment)->super_SegmentReader;
  local_9f8.capTable = &(local_9c8.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasInt64List()\"",
               (char (*) [37])"failed: expected root.hasInt64List()");
  }
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x40);
  local_998.segment = local_9c8.segment;
  local_998.capTable = local_9c8.capTable;
  PointerBuilder::getList((ListBuilder *)&local_9f8,&local_998,EIGHT_BYTES,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_a2c = 0;
    local_998.pointer =
         (WirePointer *)
         (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x40);
    local_998.segment = local_9c8.segment;
    local_998.capTable = local_9c8.capTable;
    PointerBuilder::getList((ListBuilder *)&local_9f8,&local_998,EIGHT_BYTES,(word *)0x0);
    local_974 = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt64List().size())\", 0, root.getInt64List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getInt64List().size())",
               (int *)&local_a2c,&local_974);
  }
  local_9f8.ptr =
       (byte *)(CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) +
               0x68);
  local_9f8.segment = &(local_9c8.segment)->super_SegmentReader;
  local_9f8.capTable = &(local_9c8.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasFloat32List()\"",
               (char (*) [39])"failed: expected root.hasFloat32List()");
  }
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x68);
  local_998.segment = local_9c8.segment;
  local_998.capTable = local_9c8.capTable;
  PointerBuilder::getList((ListBuilder *)&local_9f8,&local_998,FOUR_BYTES,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_a2c = 0;
    local_998.pointer =
         (WirePointer *)
         (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x68);
    local_998.segment = local_9c8.segment;
    local_998.capTable = local_9c8.capTable;
    PointerBuilder::getList((ListBuilder *)&local_9f8,&local_998,FOUR_BYTES,(word *)0x0);
    local_974 = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[55],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getFloat32List().size())\", 0, root.getFloat32List().size()"
               ,(char (*) [55])"failed: expected (0) == (root.getFloat32List().size())",
               (int *)&local_a2c,&local_974);
  }
  local_9f8.ptr =
       (byte *)(CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) +
               0x70);
  local_9f8.segment = &(local_9c8.segment)->super_SegmentReader;
  local_9f8.capTable = &(local_9c8.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasFloat64List()\"",
               (char (*) [39])"failed: expected root.hasFloat64List()");
  }
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x70);
  local_998.segment = local_9c8.segment;
  local_998.capTable = local_9c8.capTable;
  PointerBuilder::getList((ListBuilder *)&local_9f8,&local_998,EIGHT_BYTES,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_a2c = 0;
    local_998.pointer =
         (WirePointer *)
         (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x70);
    local_998.segment = local_9c8.segment;
    local_998.capTable = local_9c8.capTable;
    PointerBuilder::getList((ListBuilder *)&local_9f8,&local_998,EIGHT_BYTES,(word *)0x0);
    local_974 = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[55],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getFloat64List().size())\", 0, root.getFloat64List().size()"
               ,(char (*) [55])"failed: expected (0) == (root.getFloat64List().size())",
               (int *)&local_a2c,&local_974);
  }
  local_9f8.ptr =
       (byte *)(CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) +
               0x78);
  local_9f8.segment = &(local_9c8.segment)->super_SegmentReader;
  local_9f8.capTable = &(local_9c8.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasTextList()\"",
               (char (*) [36])"failed: expected root.hasTextList()");
  }
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x78);
  local_998.segment = local_9c8.segment;
  local_998.capTable = local_9c8.capTable;
  PointerBuilder::getList((ListBuilder *)&local_9f8,&local_998,POINTER,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_a2c = 0;
    local_998.pointer =
         (WirePointer *)
         (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x78);
    local_998.segment = local_9c8.segment;
    local_998.capTable = local_9c8.capTable;
    PointerBuilder::getList((ListBuilder *)&local_9f8,&local_998,POINTER,(word *)0x0);
    local_974 = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getTextList().size())\", 0, root.getTextList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getTextList().size())",
               (int *)&local_a2c,&local_974);
  }
  local_9f8.ptr =
       (byte *)(CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) +
               0x80);
  local_9f8.segment = &(local_9c8.segment)->super_SegmentReader;
  local_9f8.capTable = &(local_9c8.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasDataList()\"",
               (char (*) [36])"failed: expected root.hasDataList()");
  }
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x80);
  local_998.segment = local_9c8.segment;
  local_998.capTable = local_9c8.capTable;
  PointerBuilder::getList((ListBuilder *)&local_9f8,&local_998,POINTER,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_a2c = 0;
    local_998.pointer =
         (WirePointer *)
         (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x80);
    local_998.segment = local_9c8.segment;
    local_998.capTable = local_9c8.capTable;
    PointerBuilder::getList((ListBuilder *)&local_9f8,&local_998,POINTER,(word *)0x0);
    local_974 = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getDataList().size())\", 0, root.getDataList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getDataList().size())",
               (int *)&local_a2c,&local_974);
  }
  local_9f8.ptr =
       (byte *)(CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) +
               0x88);
  local_9f8.segment = &(local_9c8.segment)->super_SegmentReader;
  local_9f8.capTable = &(local_9c8.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasStructList()\"",
               (char (*) [38])"failed: expected root.hasStructList()");
  }
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x88);
  local_998.segment = local_9c8.segment;
  local_998.capTable = local_9c8.capTable;
  PointerBuilder::getStructList
            ((ListBuilder *)&local_9f8,&local_998,(StructSize)0x140006,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_a2c = 0;
    local_998.pointer =
         (WirePointer *)
         (CONCAT17(local_9c8.step._3_1_,CONCAT16(local_9c8.step._2_1_,local_9c8._24_6_)) + 0x88);
    local_998.segment = local_9c8.segment;
    local_998.capTable = local_9c8.capTable;
    PointerBuilder::getStructList
              ((ListBuilder *)&local_9f8,&local_998,(StructSize)0x140006,(word *)0x0);
    local_974 = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getStructList().size())\", 0, root.getStructList().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getStructList().size())",
               (int *)&local_a2c,&local_974);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_100);
  MallocMessageBuilder::MallocMessageBuilder(&local_100,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_9c8,&local_100.super_MessageBuilder);
  local_9f8.ptr = local_9c8.ptr;
  local_9f8.segment = &(local_9c8.segment)->super_SegmentReader;
  local_9f8.capTable = &(local_9c8.capTable)->super_CapTableReader;
  PointerBuilder::initStruct(&local_a28,(PointerBuilder *)&local_9f8,(StructSize)0x140006);
  local_9f8.ptr = (byte *)(local_a28.pointers + 3);
  PointerBuilder::getList(&local_9c8,(PointerBuilder *)&local_9f8,VOID,(word *)0x0);
  ListBuilder::asReader(&local_9c8);
  local_9f8._32_6_ = SUB86(local_3e0,0);
  local_9f8.elementSize = (ElementSize)((ulong)local_3e0 >> 0x30);
  local_9f8._39_1_ = SUB81((ulong)local_3e0 >> 0x38,0);
  local_9f8.nestingLimit = iStack_3d8;
  local_9f8._44_4_ = uStack_3d4;
  local_9f8.ptr = local_3f0;
  local_9f8.elementCount = (ListElementCount)uStack_3e8;
  local_9f8.step._0_2_ = (undefined2)((ulong)uStack_3e8 >> 0x20);
  local_9f8.step._2_1_ = (undefined1)((ulong)uStack_3e8 >> 0x30);
  local_9f8.step._3_1_ = (undefined1)((ulong)uStack_3e8 >> 0x38);
  local_9f8.segment = local_400;
  local_9f8.capTable = pCStack_3f8;
  local_998.pointer = local_a28.pointers + 3;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9f8.ptr = (byte *)(local_a28.pointers + 4);
  PointerBuilder::getList(&local_9c8,(PointerBuilder *)&local_9f8,BIT,(word *)0x0);
  ListBuilder::asReader(&local_9c8);
  local_9f8._32_6_ = SUB86(local_410,0);
  local_9f8.elementSize = (ElementSize)((ulong)local_410 >> 0x30);
  local_9f8._39_1_ = SUB81((ulong)local_410 >> 0x38,0);
  local_9f8.nestingLimit = iStack_408;
  local_9f8._44_4_ = uStack_404;
  local_9f8.ptr = local_420;
  local_9f8.elementCount = (ListElementCount)uStack_418;
  local_9f8.step._0_2_ = (undefined2)((ulong)uStack_418 >> 0x20);
  local_9f8.step._2_1_ = (undefined1)((ulong)uStack_418 >> 0x30);
  local_9f8.step._3_1_ = (undefined1)((ulong)uStack_418 >> 0x38);
  local_9f8.segment = local_430;
  local_9f8.capTable = pCStack_428;
  local_998.pointer = local_a28.pointers + 4;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9f8.ptr = (byte *)(local_a28.pointers + 9);
  PointerBuilder::getList(&local_9c8,(PointerBuilder *)&local_9f8,BYTE,(word *)0x0);
  ListBuilder::asReader(&local_9c8);
  local_9f8._32_6_ = SUB86(local_440,0);
  local_9f8.elementSize = (ElementSize)((ulong)local_440 >> 0x30);
  local_9f8._39_1_ = SUB81((ulong)local_440 >> 0x38,0);
  local_9f8.nestingLimit = iStack_438;
  local_9f8._44_4_ = uStack_434;
  local_9f8.ptr = local_450;
  local_9f8.elementCount = (ListElementCount)uStack_448;
  local_9f8.step._0_2_ = (undefined2)((ulong)uStack_448 >> 0x20);
  local_9f8.step._2_1_ = (undefined1)((ulong)uStack_448 >> 0x30);
  local_9f8.step._3_1_ = (undefined1)((ulong)uStack_448 >> 0x38);
  local_9f8.segment = local_460;
  local_9f8.capTable = pCStack_458;
  local_998.pointer = local_a28.pointers + 9;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9f8.ptr = (byte *)(local_a28.pointers + 10);
  PointerBuilder::getList(&local_9c8,(PointerBuilder *)&local_9f8,TWO_BYTES,(word *)0x0);
  ListBuilder::asReader(&local_9c8);
  local_9f8._32_6_ = SUB86(local_470,0);
  local_9f8.elementSize = (ElementSize)((ulong)local_470 >> 0x30);
  local_9f8._39_1_ = SUB81((ulong)local_470 >> 0x38,0);
  local_9f8.nestingLimit = iStack_468;
  local_9f8._44_4_ = uStack_464;
  local_9f8.ptr = local_480;
  local_9f8.elementCount = (ListElementCount)uStack_478;
  local_9f8.step._0_2_ = (undefined2)((ulong)uStack_478 >> 0x20);
  local_9f8.step._2_1_ = (undefined1)((ulong)uStack_478 >> 0x30);
  local_9f8.step._3_1_ = (undefined1)((ulong)uStack_478 >> 0x38);
  local_9f8.segment = local_490;
  local_9f8.capTable = pCStack_488;
  local_998.pointer = local_a28.pointers + 10;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9f8.ptr = (byte *)(local_a28.pointers + 0xb);
  PointerBuilder::getList(&local_9c8,(PointerBuilder *)&local_9f8,FOUR_BYTES,(word *)0x0);
  ListBuilder::asReader(&local_9c8);
  local_9f8._32_6_ = SUB86(local_4a0,0);
  local_9f8.elementSize = (ElementSize)((ulong)local_4a0 >> 0x30);
  local_9f8._39_1_ = SUB81((ulong)local_4a0 >> 0x38,0);
  local_9f8.nestingLimit = iStack_498;
  local_9f8._44_4_ = uStack_494;
  local_9f8.ptr = local_4b0;
  local_9f8.elementCount = (ListElementCount)uStack_4a8;
  local_9f8.step._0_2_ = (undefined2)((ulong)uStack_4a8 >> 0x20);
  local_9f8.step._2_1_ = (undefined1)((ulong)uStack_4a8 >> 0x30);
  local_9f8.step._3_1_ = (undefined1)((ulong)uStack_4a8 >> 0x38);
  local_9f8.segment = local_4c0;
  local_9f8.capTable = pCStack_4b8;
  local_998.pointer = local_a28.pointers + 0xb;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9f8.ptr = (byte *)(local_a28.pointers + 0xc);
  PointerBuilder::getList(&local_9c8,(PointerBuilder *)&local_9f8,EIGHT_BYTES,(word *)0x0);
  ListBuilder::asReader(&local_9c8);
  local_9f8._32_6_ = SUB86(local_4d0,0);
  local_9f8.elementSize = (ElementSize)((ulong)local_4d0 >> 0x30);
  local_9f8._39_1_ = SUB81((ulong)local_4d0 >> 0x38,0);
  local_9f8.nestingLimit = iStack_4c8;
  local_9f8._44_4_ = uStack_4c4;
  local_9f8.ptr = local_4e0;
  local_9f8.elementCount = (ListElementCount)uStack_4d8;
  local_9f8.step._0_2_ = (undefined2)((ulong)uStack_4d8 >> 0x20);
  local_9f8.step._2_1_ = (undefined1)((ulong)uStack_4d8 >> 0x30);
  local_9f8.step._3_1_ = (undefined1)((ulong)uStack_4d8 >> 0x38);
  local_9f8.segment = local_4f0;
  local_9f8.capTable = pCStack_4e8;
  local_998.pointer = local_a28.pointers + 0xc;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9f8.ptr = (byte *)(local_a28.pointers + 5);
  PointerBuilder::getList(&local_9c8,(PointerBuilder *)&local_9f8,BYTE,(word *)0x0);
  ListBuilder::asReader(&local_9c8);
  local_9f8._32_6_ = SUB86(local_500,0);
  local_9f8.elementSize = (ElementSize)((ulong)local_500 >> 0x30);
  local_9f8._39_1_ = SUB81((ulong)local_500 >> 0x38,0);
  local_9f8.nestingLimit = iStack_4f8;
  local_9f8._44_4_ = uStack_4f4;
  local_9f8.ptr = local_510;
  local_9f8.elementCount = (ListElementCount)uStack_508;
  local_9f8.step._0_2_ = (undefined2)((ulong)uStack_508 >> 0x20);
  local_9f8.step._2_1_ = (undefined1)((ulong)uStack_508 >> 0x30);
  local_9f8.step._3_1_ = (undefined1)((ulong)uStack_508 >> 0x38);
  local_9f8.segment = local_520;
  local_9f8.capTable = pCStack_518;
  local_998.pointer = local_a28.pointers + 5;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9f8.ptr = (byte *)(local_a28.pointers + 6);
  PointerBuilder::getList(&local_9c8,(PointerBuilder *)&local_9f8,TWO_BYTES,(word *)0x0);
  ListBuilder::asReader(&local_9c8);
  local_9f8._32_6_ = SUB86(local_530,0);
  local_9f8.elementSize = (ElementSize)((ulong)local_530 >> 0x30);
  local_9f8._39_1_ = SUB81((ulong)local_530 >> 0x38,0);
  local_9f8.nestingLimit = iStack_528;
  local_9f8._44_4_ = uStack_524;
  local_9f8.ptr = local_540;
  local_9f8.elementCount = (ListElementCount)uStack_538;
  local_9f8.step._0_2_ = (undefined2)((ulong)uStack_538 >> 0x20);
  local_9f8.step._2_1_ = (undefined1)((ulong)uStack_538 >> 0x30);
  local_9f8.step._3_1_ = (undefined1)((ulong)uStack_538 >> 0x38);
  local_9f8.segment = local_550;
  local_9f8.capTable = pCStack_548;
  local_998.pointer = local_a28.pointers + 6;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9f8.ptr = (byte *)(local_a28.pointers + 7);
  PointerBuilder::getList(&local_9c8,(PointerBuilder *)&local_9f8,FOUR_BYTES,(word *)0x0);
  ListBuilder::asReader(&local_9c8);
  local_9f8._32_6_ = SUB86(local_560,0);
  local_9f8.elementSize = (ElementSize)((ulong)local_560 >> 0x30);
  local_9f8._39_1_ = SUB81((ulong)local_560 >> 0x38,0);
  local_9f8.nestingLimit = iStack_558;
  local_9f8._44_4_ = uStack_554;
  local_9f8.ptr = local_570;
  local_9f8.elementCount = (ListElementCount)uStack_568;
  local_9f8.step._0_2_ = (undefined2)((ulong)uStack_568 >> 0x20);
  local_9f8.step._2_1_ = (undefined1)((ulong)uStack_568 >> 0x30);
  local_9f8.step._3_1_ = (undefined1)((ulong)uStack_568 >> 0x38);
  local_9f8.segment = local_580;
  local_9f8.capTable = pCStack_578;
  local_998.pointer = local_a28.pointers + 7;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9f8.ptr = (byte *)(local_a28.pointers + 8);
  PointerBuilder::getList(&local_9c8,(PointerBuilder *)&local_9f8,EIGHT_BYTES,(word *)0x0);
  ListBuilder::asReader(&local_9c8);
  local_9f8._32_6_ = SUB86(local_590,0);
  local_9f8.elementSize = (ElementSize)((ulong)local_590 >> 0x30);
  local_9f8._39_1_ = SUB81((ulong)local_590 >> 0x38,0);
  local_9f8.nestingLimit = iStack_588;
  local_9f8._44_4_ = uStack_584;
  local_9f8.ptr = local_5a0;
  local_9f8.elementCount = (ListElementCount)uStack_598;
  local_9f8.step._0_2_ = (undefined2)((ulong)uStack_598 >> 0x20);
  local_9f8.step._2_1_ = (undefined1)((ulong)uStack_598 >> 0x30);
  local_9f8.step._3_1_ = (undefined1)((ulong)uStack_598 >> 0x38);
  local_9f8.segment = local_5b0;
  local_9f8.capTable = pCStack_5a8;
  local_998.pointer = local_a28.pointers + 8;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9f8.ptr = (byte *)(local_a28.pointers + 0xd);
  PointerBuilder::getList(&local_9c8,(PointerBuilder *)&local_9f8,FOUR_BYTES,(word *)0x0);
  ListBuilder::asReader(&local_9c8);
  local_9f8._32_6_ = SUB86(local_5c0,0);
  local_9f8.elementSize = (ElementSize)((ulong)local_5c0 >> 0x30);
  local_9f8._39_1_ = SUB81((ulong)local_5c0 >> 0x38,0);
  local_9f8.nestingLimit = iStack_5b8;
  local_9f8._44_4_ = uStack_5b4;
  local_9f8.ptr = local_5d0;
  local_9f8.elementCount = (ListElementCount)uStack_5c8;
  local_9f8.step._0_2_ = (undefined2)((ulong)uStack_5c8 >> 0x20);
  local_9f8.step._2_1_ = (undefined1)((ulong)uStack_5c8 >> 0x30);
  local_9f8.step._3_1_ = (undefined1)((ulong)uStack_5c8 >> 0x38);
  local_9f8.segment = local_5e0;
  local_9f8.capTable = pCStack_5d8;
  local_998.pointer = local_a28.pointers + 0xd;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9f8.ptr = (byte *)(local_a28.pointers + 0xe);
  PointerBuilder::getList(&local_9c8,(PointerBuilder *)&local_9f8,EIGHT_BYTES,(word *)0x0);
  ListBuilder::asReader(&local_9c8);
  local_9f8._32_6_ = SUB86(local_5f0,0);
  local_9f8.elementSize = (ElementSize)((ulong)local_5f0 >> 0x30);
  local_9f8._39_1_ = SUB81((ulong)local_5f0 >> 0x38,0);
  local_9f8.nestingLimit = iStack_5e8;
  local_9f8._44_4_ = uStack_5e4;
  local_9f8.ptr = local_600;
  local_9f8.elementCount = (ListElementCount)uStack_5f8;
  local_9f8.step._0_2_ = (undefined2)((ulong)uStack_5f8 >> 0x20);
  local_9f8.step._2_1_ = (undefined1)((ulong)uStack_5f8 >> 0x30);
  local_9f8.step._3_1_ = (undefined1)((ulong)uStack_5f8 >> 0x38);
  local_9f8.segment = local_610;
  local_9f8.capTable = pCStack_608;
  local_998.pointer = local_a28.pointers + 0xe;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9f8.ptr = (byte *)(local_a28.pointers + 0xf);
  PointerBuilder::getList(&local_9c8,(PointerBuilder *)&local_9f8,POINTER,(word *)0x0);
  ListBuilder::asReader(&local_9c8);
  local_9f8._32_6_ = SUB86(local_620,0);
  local_9f8.elementSize = (ElementSize)((ulong)local_620 >> 0x30);
  local_9f8._39_1_ = SUB81((ulong)local_620 >> 0x38,0);
  local_9f8.nestingLimit = iStack_618;
  local_9f8._44_4_ = uStack_614;
  local_9f8.ptr = local_630;
  local_9f8.elementCount = (ListElementCount)uStack_628;
  local_9f8.step._0_2_ = (undefined2)((ulong)uStack_628 >> 0x20);
  local_9f8.step._2_1_ = (undefined1)((ulong)uStack_628 >> 0x30);
  local_9f8.step._3_1_ = (undefined1)((ulong)uStack_628 >> 0x38);
  local_9f8.segment = local_640;
  local_9f8.capTable = pCStack_638;
  local_998.pointer = local_a28.pointers + 0xf;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9f8.ptr = (byte *)(local_a28.pointers + 0x10);
  PointerBuilder::getList(&local_9c8,(PointerBuilder *)&local_9f8,POINTER,(word *)0x0);
  ListBuilder::asReader(&local_9c8);
  local_9f8._32_6_ = SUB86(local_650,0);
  local_9f8.elementSize = (ElementSize)((ulong)local_650 >> 0x30);
  local_9f8._39_1_ = SUB81((ulong)local_650 >> 0x38,0);
  local_9f8.nestingLimit = iStack_648;
  local_9f8._44_4_ = uStack_644;
  local_9f8.ptr = local_660;
  local_9f8.elementCount = (ListElementCount)uStack_658;
  local_9f8.step._0_2_ = (undefined2)((ulong)uStack_658 >> 0x20);
  local_9f8.step._2_1_ = (undefined1)((ulong)uStack_658 >> 0x30);
  local_9f8.step._3_1_ = (undefined1)((ulong)uStack_658 >> 0x38);
  local_9f8.segment = local_670;
  local_9f8.capTable = pCStack_668;
  local_998.pointer = local_a28.pointers + 0x10;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9f8.ptr = (byte *)(local_a28.pointers + 0x11);
  PointerBuilder::getStructList
            (&local_9c8,(PointerBuilder *)&local_9f8,(StructSize)0x140006,(word *)0x0);
  ListBuilder::asReader(&local_9c8);
  local_9f8._32_6_ = SUB86(local_680,0);
  local_9f8.elementSize = (ElementSize)((ulong)local_680 >> 0x30);
  local_9f8._39_1_ = SUB81((ulong)local_680 >> 0x38,0);
  local_9f8.nestingLimit = iStack_678;
  local_9f8._44_4_ = uStack_674;
  local_9f8.ptr = local_690;
  local_9f8.elementCount = (ListElementCount)uStack_688;
  local_9f8.step._0_2_ = (undefined2)((ulong)uStack_688 >> 0x20);
  local_9f8.step._2_1_ = (undefined1)((ulong)uStack_688 >> 0x30);
  local_9f8.step._3_1_ = (undefined1)((ulong)uStack_688 >> 0x38);
  local_9f8.segment = local_6a0;
  local_9f8.capTable = pCStack_698;
  local_998.pointer = local_a28.pointers + 0x11;
  local_998.segment = (SegmentBuilder *)CONCAT44(local_a28.segment._4_4_,local_a28.segment._0_4_);
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9f8.ptr = (byte *)(local_a28.pointers + 3);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasVoidList()\"",
               (char (*) [36])"failed: expected root.hasVoidList()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 3);
  PointerBuilder::getList((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,VOID,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 3);
    PointerBuilder::getList((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,VOID,(word *)0x0)
    ;
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getVoidList().size())\", 0, root.getVoidList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getVoidList().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 4);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasBoolList()\"",
               (char (*) [36])"failed: expected root.hasBoolList()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 4);
  PointerBuilder::getList((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,BIT,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 4);
    PointerBuilder::getList((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,BIT,(word *)0x0);
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getBoolList().size())\", 0, root.getBoolList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getBoolList().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 9);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasUInt8List()\"",
               (char (*) [37])"failed: expected root.hasUInt8List()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 9);
  PointerBuilder::getList((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,BYTE,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 9);
    PointerBuilder::getList((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,BYTE,(word *)0x0)
    ;
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt8List().size())\", 0, root.getUInt8List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getUInt8List().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 10);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasUInt16List()\"",
               (char (*) [38])"failed: expected root.hasUInt16List()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 10);
  PointerBuilder::getList
            ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,TWO_BYTES,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 10);
    PointerBuilder::getList
              ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,TWO_BYTES,(word *)0x0);
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt16List().size())\", 0, root.getUInt16List().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getUInt16List().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 0xb);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasUInt32List()\"",
               (char (*) [38])"failed: expected root.hasUInt32List()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 0xb);
  PointerBuilder::getList
            ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,FOUR_BYTES,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 0xb);
    PointerBuilder::getList
              ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,FOUR_BYTES,(word *)0x0);
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt32List().size())\", 0, root.getUInt32List().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getUInt32List().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 0xc);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasUInt64List()\"",
               (char (*) [38])"failed: expected root.hasUInt64List()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 0xc);
  PointerBuilder::getList
            ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,EIGHT_BYTES,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 0xc);
    PointerBuilder::getList
              ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,EIGHT_BYTES,(word *)0x0);
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt64List().size())\", 0, root.getUInt64List().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getUInt64List().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 5);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasInt8List()\"",
               (char (*) [36])"failed: expected root.hasInt8List()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 5);
  PointerBuilder::getList((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,BYTE,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 5);
    PointerBuilder::getList((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,BYTE,(word *)0x0)
    ;
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt8List().size())\", 0, root.getInt8List().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getInt8List().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 6);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasInt16List()\"",
               (char (*) [37])"failed: expected root.hasInt16List()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 6);
  PointerBuilder::getList
            ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,TWO_BYTES,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 6);
    PointerBuilder::getList
              ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,TWO_BYTES,(word *)0x0);
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt16List().size())\", 0, root.getInt16List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getInt16List().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 7);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasInt32List()\"",
               (char (*) [37])"failed: expected root.hasInt32List()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 7);
  PointerBuilder::getList
            ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,FOUR_BYTES,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 7);
    PointerBuilder::getList
              ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,FOUR_BYTES,(word *)0x0);
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt32List().size())\", 0, root.getInt32List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getInt32List().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 8);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasInt64List()\"",
               (char (*) [37])"failed: expected root.hasInt64List()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 8);
  PointerBuilder::getList
            ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,EIGHT_BYTES,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 8);
    PointerBuilder::getList
              ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,EIGHT_BYTES,(word *)0x0);
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt64List().size())\", 0, root.getInt64List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getInt64List().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 0xd);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasFloat32List()\"",
               (char (*) [39])"failed: expected root.hasFloat32List()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 0xd);
  PointerBuilder::getList
            ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,FOUR_BYTES,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 0xd);
    PointerBuilder::getList
              ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,FOUR_BYTES,(word *)0x0);
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[55],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getFloat32List().size())\", 0, root.getFloat32List().size()"
               ,(char (*) [55])"failed: expected (0) == (root.getFloat32List().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 0xe);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasFloat64List()\"",
               (char (*) [39])"failed: expected root.hasFloat64List()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 0xe);
  PointerBuilder::getList
            ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,EIGHT_BYTES,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 0xe);
    PointerBuilder::getList
              ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,EIGHT_BYTES,(word *)0x0);
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[55],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getFloat64List().size())\", 0, root.getFloat64List().size()"
               ,(char (*) [55])"failed: expected (0) == (root.getFloat64List().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 0xf);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasTextList()\"",
               (char (*) [36])"failed: expected root.hasTextList()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 0xf);
  PointerBuilder::getList
            ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,POINTER,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 0xf);
    PointerBuilder::getList
              ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,POINTER,(word *)0x0);
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getTextList().size())\", 0, root.getTextList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getTextList().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 0x10);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasDataList()\"",
               (char (*) [36])"failed: expected root.hasDataList()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 0x10);
  PointerBuilder::getList
            ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,POINTER,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 0x10);
    PointerBuilder::getList
              ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,POINTER,(word *)0x0);
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getDataList().size())\", 0, root.getDataList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getDataList().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 0x11);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasStructList()\"",
               (char (*) [38])"failed: expected root.hasStructList()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 0x11);
  local_9c8.segment = (SegmentBuilder *)CONCAT44(local_a28.segment._4_4_,local_a28.segment._0_4_);
  local_9c8.capTable =
       (CapTableBuilder *)CONCAT44(local_a28.capTable._4_4_,local_a28.capTable._0_4_);
  PointerBuilder::getStructList
            ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,(StructSize)0x140006,(word *)0x0
            );
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 0x11);
    local_9c8.segment = (SegmentBuilder *)CONCAT44(local_a28.segment._4_4_,local_a28.segment._0_4_);
    local_9c8.capTable =
         (CapTableBuilder *)CONCAT44(local_a28.capTable._4_4_,local_a28.capTable._0_4_);
    PointerBuilder::getStructList
              ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,(StructSize)0x140006,
               (word *)0x0);
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getStructList().size())\", 0, root.getStructList().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getStructList().size())",
               (int *)&local_998,&local_a2c);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_100);
  MallocMessageBuilder::MallocMessageBuilder(&local_100,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_9c8,&local_100.super_MessageBuilder);
  local_9f8.ptr = local_9c8.ptr;
  local_9f8.segment = &(local_9c8.segment)->super_SegmentReader;
  local_9f8.capTable = &(local_9c8.capTable)->super_CapTableReader;
  PointerBuilder::initStruct(&local_a28,(PointerBuilder *)&local_9f8,(StructSize)0x140006);
  local_9f8.ptr = (byte *)0x0;
  local_9f8.elementCount = 0;
  local_9f8.step._0_2_ = 0;
  local_9f8.step._2_1_ = 0;
  local_9f8.segment = (SegmentReader *)0x0;
  local_9f8.capTable = (CapTableReader *)0x0;
  local_9f8.step._3_1_ = 0;
  local_9f8.structDataSize = 0;
  local_9f8.structPointerCount = 0;
  local_9f8.elementSize = VOID;
  local_9c8.ptr = (byte *)(local_a28.pointers + 3);
  local_9f8.nestingLimit = 0x7fffffff;
  PointerBuilder::setList((PointerBuilder *)&local_9c8,&local_9f8,false);
  local_9f8.ptr = (byte *)0x0;
  local_9f8.elementCount = 0;
  local_9f8.step._0_2_ = 0;
  local_9f8.segment = (SegmentReader *)0x0;
  local_9f8.capTable = (CapTableReader *)0x0;
  local_9f8.step._2_1_ = 0;
  local_9f8.step._3_1_ = 0;
  local_9f8.structDataSize = 0;
  local_9f8.structPointerCount = 0;
  local_9c8.ptr = (byte *)(local_a28.pointers + 4);
  local_9f8.elementSize = BIT;
  local_9f8.nestingLimit = 0x7fffffff;
  PointerBuilder::setList((PointerBuilder *)&local_9c8,&local_9f8,false);
  local_9f8.ptr = (byte *)0x0;
  local_9f8.elementCount = 0;
  local_9f8.step._0_2_ = 0;
  local_9f8.segment = (SegmentReader *)0x0;
  local_9f8.capTable = (CapTableReader *)0x0;
  local_9f8.step._2_1_ = 0;
  local_9f8.step._3_1_ = 0;
  local_9f8.structDataSize = 0;
  local_9f8.structPointerCount = 0;
  local_9c8.ptr = (byte *)(local_a28.pointers + 9);
  local_9f8.elementSize = BYTE;
  local_9f8.nestingLimit = 0x7fffffff;
  PointerBuilder::setList((PointerBuilder *)&local_9c8,&local_9f8,false);
  local_9f8.ptr = (byte *)0x0;
  local_9f8.elementCount = 0;
  local_9f8.step._0_2_ = 0;
  local_9f8.segment = (SegmentReader *)0x0;
  local_9f8.capTable = (CapTableReader *)0x0;
  local_9f8.step._2_1_ = 0;
  local_9f8.step._3_1_ = 0;
  local_9f8.structDataSize = 0;
  local_9f8.structPointerCount = 0;
  local_9c8.ptr = (byte *)(local_a28.pointers + 10);
  local_9f8.elementSize = TWO_BYTES;
  local_9f8.nestingLimit = 0x7fffffff;
  PointerBuilder::setList((PointerBuilder *)&local_9c8,&local_9f8,false);
  local_9f8.ptr = (byte *)0x0;
  local_9f8.elementCount = 0;
  local_9f8.step._0_2_ = 0;
  local_9f8.segment = (SegmentReader *)0x0;
  local_9f8.capTable = (CapTableReader *)0x0;
  local_9f8.step._2_1_ = 0;
  local_9f8.step._3_1_ = 0;
  local_9f8.structDataSize = 0;
  local_9f8.structPointerCount = 0;
  local_9c8.ptr = (byte *)(local_a28.pointers + 0xb);
  local_9f8.elementSize = FOUR_BYTES;
  local_9f8.nestingLimit = 0x7fffffff;
  PointerBuilder::setList((PointerBuilder *)&local_9c8,&local_9f8,false);
  local_9f8.ptr = (byte *)0x0;
  local_9f8.elementCount = 0;
  local_9f8.step._0_2_ = 0;
  local_9f8.segment = (SegmentReader *)0x0;
  local_9f8.capTable = (CapTableReader *)0x0;
  local_9f8.step._2_1_ = 0;
  local_9f8.step._3_1_ = 0;
  local_9f8.structDataSize = 0;
  local_9f8.structPointerCount = 0;
  local_9c8.ptr = (byte *)(local_a28.pointers + 0xc);
  local_9f8.elementSize = EIGHT_BYTES;
  local_9f8.nestingLimit = 0x7fffffff;
  PointerBuilder::setList((PointerBuilder *)&local_9c8,&local_9f8,false);
  local_9f8.ptr = (byte *)0x0;
  local_9f8.elementCount = 0;
  local_9f8.step._0_2_ = 0;
  local_9f8.segment = (SegmentReader *)0x0;
  local_9f8.capTable = (CapTableReader *)0x0;
  local_9f8.step._2_1_ = 0;
  local_9f8.step._3_1_ = 0;
  local_9f8.structDataSize = 0;
  local_9f8.structPointerCount = 0;
  local_9c8.ptr = (byte *)(local_a28.pointers + 5);
  local_9f8.elementSize = BYTE;
  local_9f8.nestingLimit = 0x7fffffff;
  PointerBuilder::setList((PointerBuilder *)&local_9c8,&local_9f8,false);
  local_9f8.ptr = (byte *)0x0;
  local_9f8.elementCount = 0;
  local_9f8.step._0_2_ = 0;
  local_9f8.segment = (SegmentReader *)0x0;
  local_9f8.capTable = (CapTableReader *)0x0;
  local_9f8.step._2_1_ = 0;
  local_9f8.step._3_1_ = 0;
  local_9f8.structDataSize = 0;
  local_9f8.structPointerCount = 0;
  local_9c8.ptr = (byte *)(local_a28.pointers + 6);
  local_9f8.elementSize = TWO_BYTES;
  local_9f8.nestingLimit = 0x7fffffff;
  PointerBuilder::setList((PointerBuilder *)&local_9c8,&local_9f8,false);
  local_9f8.ptr = (byte *)0x0;
  local_9f8.elementCount = 0;
  local_9f8.step._0_2_ = 0;
  local_9f8.segment = (SegmentReader *)0x0;
  local_9f8.capTable = (CapTableReader *)0x0;
  local_9f8.step._2_1_ = 0;
  local_9f8.step._3_1_ = 0;
  local_9f8.structDataSize = 0;
  local_9f8.structPointerCount = 0;
  local_9c8.ptr = (byte *)(local_a28.pointers + 7);
  local_9f8.elementSize = FOUR_BYTES;
  local_9f8.nestingLimit = 0x7fffffff;
  PointerBuilder::setList((PointerBuilder *)&local_9c8,&local_9f8,false);
  local_9f8.ptr = (byte *)0x0;
  local_9f8.elementCount = 0;
  local_9f8.step._0_2_ = 0;
  local_9f8.segment = (SegmentReader *)0x0;
  local_9f8.capTable = (CapTableReader *)0x0;
  local_9f8.step._2_1_ = 0;
  local_9f8.step._3_1_ = 0;
  local_9f8.structDataSize = 0;
  local_9f8.structPointerCount = 0;
  local_9c8.ptr = (byte *)(local_a28.pointers + 8);
  local_9f8.elementSize = EIGHT_BYTES;
  local_9f8.nestingLimit = 0x7fffffff;
  PointerBuilder::setList((PointerBuilder *)&local_9c8,&local_9f8,false);
  local_9f8.ptr = (byte *)0x0;
  local_9f8.elementCount = 0;
  local_9f8.step._0_2_ = 0;
  local_9f8.segment = (SegmentReader *)0x0;
  local_9f8.capTable = (CapTableReader *)0x0;
  local_9f8.step._2_1_ = 0;
  local_9f8.step._3_1_ = 0;
  local_9f8.structDataSize = 0;
  local_9f8.structPointerCount = 0;
  local_9c8.ptr = (byte *)(local_a28.pointers + 0xd);
  local_9f8.elementSize = FOUR_BYTES;
  local_9f8.nestingLimit = 0x7fffffff;
  PointerBuilder::setList((PointerBuilder *)&local_9c8,&local_9f8,false);
  local_9f8.ptr = (byte *)0x0;
  local_9f8.elementCount = 0;
  local_9f8.step._0_2_ = 0;
  local_9f8.segment = (SegmentReader *)0x0;
  local_9f8.capTable = (CapTableReader *)0x0;
  local_9f8.step._2_1_ = 0;
  local_9f8.step._3_1_ = 0;
  local_9f8.structDataSize = 0;
  local_9f8.structPointerCount = 0;
  local_9c8.ptr = (byte *)(local_a28.pointers + 0xe);
  local_9f8.elementSize = EIGHT_BYTES;
  local_9f8.nestingLimit = 0x7fffffff;
  PointerBuilder::setList((PointerBuilder *)&local_9c8,&local_9f8,false);
  local_9f8.ptr = (byte *)0x0;
  local_9f8.elementCount = 0;
  local_9f8.step._0_2_ = 0;
  local_9f8.segment = (SegmentReader *)0x0;
  local_9f8.capTable = (CapTableReader *)0x0;
  local_9f8.step._2_1_ = 0;
  local_9f8.step._3_1_ = 0;
  local_9f8.structDataSize = 0;
  local_9f8.structPointerCount = 0;
  local_9c8.ptr = (byte *)(local_a28.pointers + 0xf);
  local_9f8.elementSize = POINTER;
  local_9f8.nestingLimit = 0x7fffffff;
  PointerBuilder::setList((PointerBuilder *)&local_9c8,&local_9f8,false);
  local_9f8.ptr = (byte *)0x0;
  local_9f8.elementCount = 0;
  local_9f8.step._0_2_ = 0;
  local_9f8.segment = (SegmentReader *)0x0;
  local_9f8.capTable = (CapTableReader *)0x0;
  local_9f8.step._2_1_ = 0;
  local_9f8.step._3_1_ = 0;
  local_9f8.structDataSize = 0;
  local_9f8.structPointerCount = 0;
  local_9c8.ptr = (byte *)(local_a28.pointers + 0x10);
  local_9f8.elementSize = POINTER;
  local_9f8.nestingLimit = 0x7fffffff;
  PointerBuilder::setList((PointerBuilder *)&local_9c8,&local_9f8,false);
  local_9f8.ptr = (byte *)0x0;
  local_9f8.elementCount = 0;
  local_9f8.step._0_2_ = 0;
  local_9f8.segment = (SegmentReader *)0x0;
  local_9f8.capTable = (CapTableReader *)0x0;
  local_9f8.step._2_1_ = 0;
  local_9f8.step._3_1_ = 0;
  local_9f8.structDataSize = 0;
  local_9f8.structPointerCount = 0;
  local_9c8.ptr = (byte *)(local_a28.pointers + 0x11);
  local_9f8.elementSize = INLINE_COMPOSITE;
  local_9f8.nestingLimit = 0x7fffffff;
  PointerBuilder::setList((PointerBuilder *)&local_9c8,&local_9f8,false);
  local_9f8.ptr = (byte *)(local_a28.pointers + 3);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasVoidList()\"",
               (char (*) [36])"failed: expected root.hasVoidList()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 3);
  PointerBuilder::getList((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,VOID,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 3);
    PointerBuilder::getList((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,VOID,(word *)0x0)
    ;
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getVoidList().size())\", 0, root.getVoidList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getVoidList().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 4);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasBoolList()\"",
               (char (*) [36])"failed: expected root.hasBoolList()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 4);
  PointerBuilder::getList((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,BIT,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 4);
    PointerBuilder::getList((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,BIT,(word *)0x0);
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getBoolList().size())\", 0, root.getBoolList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getBoolList().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 9);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasUInt8List()\"",
               (char (*) [37])"failed: expected root.hasUInt8List()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 9);
  PointerBuilder::getList((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,BYTE,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 9);
    PointerBuilder::getList((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,BYTE,(word *)0x0)
    ;
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt8List().size())\", 0, root.getUInt8List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getUInt8List().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 10);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasUInt16List()\"",
               (char (*) [38])"failed: expected root.hasUInt16List()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 10);
  PointerBuilder::getList
            ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,TWO_BYTES,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 10);
    PointerBuilder::getList
              ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,TWO_BYTES,(word *)0x0);
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt16List().size())\", 0, root.getUInt16List().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getUInt16List().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 0xb);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasUInt32List()\"",
               (char (*) [38])"failed: expected root.hasUInt32List()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 0xb);
  PointerBuilder::getList
            ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,FOUR_BYTES,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 0xb);
    PointerBuilder::getList
              ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,FOUR_BYTES,(word *)0x0);
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt32List().size())\", 0, root.getUInt32List().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getUInt32List().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 0xc);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasUInt64List()\"",
               (char (*) [38])"failed: expected root.hasUInt64List()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 0xc);
  PointerBuilder::getList
            ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,EIGHT_BYTES,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 0xc);
    PointerBuilder::getList
              ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,EIGHT_BYTES,(word *)0x0);
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt64List().size())\", 0, root.getUInt64List().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getUInt64List().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 5);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasInt8List()\"",
               (char (*) [36])"failed: expected root.hasInt8List()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 5);
  PointerBuilder::getList((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,BYTE,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 5);
    PointerBuilder::getList((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,BYTE,(word *)0x0)
    ;
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt8List().size())\", 0, root.getInt8List().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getInt8List().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 6);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasInt16List()\"",
               (char (*) [37])"failed: expected root.hasInt16List()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 6);
  PointerBuilder::getList
            ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,TWO_BYTES,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 6);
    PointerBuilder::getList
              ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,TWO_BYTES,(word *)0x0);
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt16List().size())\", 0, root.getInt16List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getInt16List().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 7);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasInt32List()\"",
               (char (*) [37])"failed: expected root.hasInt32List()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 7);
  PointerBuilder::getList
            ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,FOUR_BYTES,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 7);
    PointerBuilder::getList
              ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,FOUR_BYTES,(word *)0x0);
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt32List().size())\", 0, root.getInt32List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getInt32List().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 8);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasInt64List()\"",
               (char (*) [37])"failed: expected root.hasInt64List()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 8);
  PointerBuilder::getList
            ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,EIGHT_BYTES,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 8);
    PointerBuilder::getList
              ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,EIGHT_BYTES,(word *)0x0);
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt64List().size())\", 0, root.getInt64List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getInt64List().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 0xd);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasFloat32List()\"",
               (char (*) [39])"failed: expected root.hasFloat32List()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 0xd);
  PointerBuilder::getList
            ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,FOUR_BYTES,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 0xd);
    PointerBuilder::getList
              ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,FOUR_BYTES,(word *)0x0);
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[55],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getFloat32List().size())\", 0, root.getFloat32List().size()"
               ,(char (*) [55])"failed: expected (0) == (root.getFloat32List().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 0xe);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasFloat64List()\"",
               (char (*) [39])"failed: expected root.hasFloat64List()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 0xe);
  PointerBuilder::getList
            ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,EIGHT_BYTES,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 0xe);
    PointerBuilder::getList
              ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,EIGHT_BYTES,(word *)0x0);
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[55],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getFloat64List().size())\", 0, root.getFloat64List().size()"
               ,(char (*) [55])"failed: expected (0) == (root.getFloat64List().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 0xf);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasTextList()\"",
               (char (*) [36])"failed: expected root.hasTextList()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 0xf);
  PointerBuilder::getList
            ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,POINTER,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 0xf);
    PointerBuilder::getList
              ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,POINTER,(word *)0x0);
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getTextList().size())\", 0, root.getTextList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getTextList().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 0x10);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasDataList()\"",
               (char (*) [36])"failed: expected root.hasDataList()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 0x10);
  PointerBuilder::getList
            ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,POINTER,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 0x10);
    PointerBuilder::getList
              ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,POINTER,(word *)0x0);
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getDataList().size())\", 0, root.getDataList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getDataList().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 0x11);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasStructList()\"",
               (char (*) [38])"failed: expected root.hasStructList()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 0x11);
  local_9c8.segment = (SegmentBuilder *)CONCAT44(local_a28.segment._4_4_,local_a28.segment._0_4_);
  local_9c8.capTable =
       (CapTableBuilder *)CONCAT44(local_a28.capTable._4_4_,local_a28.capTable._0_4_);
  PointerBuilder::getStructList
            ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,(StructSize)0x140006,(word *)0x0
            );
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 0x11);
    local_9c8.segment = (SegmentBuilder *)CONCAT44(local_a28.segment._4_4_,local_a28.segment._0_4_);
    local_9c8.capTable =
         (CapTableBuilder *)CONCAT44(local_a28.capTable._4_4_,local_a28.capTable._0_4_);
    PointerBuilder::getStructList
              ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,(StructSize)0x140006,
               (word *)0x0);
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getStructList().size())\", 0, root.getStructList().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getStructList().size())",
               (int *)&local_998,&local_a2c);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_100);
  MallocMessageBuilder::MallocMessageBuilder(&local_100,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_9c8,&local_100.super_MessageBuilder);
  local_9f8.ptr = local_9c8.ptr;
  local_9f8.segment = &(local_9c8.segment)->super_SegmentReader;
  local_9f8.capTable = &(local_9c8.capTable)->super_CapTableReader;
  PointerBuilder::initStruct(&local_a28,(PointerBuilder *)&local_9f8,(StructSize)0x140006);
  local_9c8.ptr = (byte *)0x0;
  local_9c8._24_6_ = 0;
  local_9c8.step._2_1_ = 0;
  local_9c8.segment = (SegmentBuilder *)0x0;
  local_9c8.capTable = (CapTableBuilder *)0x0;
  local_9c8.step._3_1_ = 0;
  local_9c8.structDataSize = 0;
  local_9c8.structPointerCount = 0;
  local_9c8.elementSize = VOID;
  ListBuilder::asReader(&local_9c8);
  local_9f8._32_6_ = SUB86(local_6b0,0);
  local_9f8.elementSize = (ElementSize)((ulong)local_6b0 >> 0x30);
  local_9f8._39_1_ = SUB81((ulong)local_6b0 >> 0x38,0);
  local_9f8.nestingLimit = iStack_6a8;
  local_9f8._44_4_ = uStack_6a4;
  local_9f8.ptr = local_6c0;
  local_9f8.elementCount = (ListElementCount)uStack_6b8;
  local_9f8.step._0_2_ = (undefined2)((ulong)uStack_6b8 >> 0x20);
  local_9f8.step._2_1_ = (undefined1)((ulong)uStack_6b8 >> 0x30);
  local_9f8.step._3_1_ = (undefined1)((ulong)uStack_6b8 >> 0x38);
  local_9f8.segment = local_6d0;
  local_9f8.capTable = pCStack_6c8;
  local_998.pointer = local_a28.pointers + 3;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9c8.ptr = (byte *)0x0;
  local_9c8._24_6_ = 0;
  local_9c8.segment = (SegmentBuilder *)0x0;
  local_9c8.capTable = (CapTableBuilder *)0x0;
  local_9c8.step._2_1_ = 0;
  local_9c8.step._3_1_ = 0;
  local_9c8.structDataSize = 0;
  local_9c8.structPointerCount = 0;
  local_9c8.elementSize = BIT;
  ListBuilder::asReader(&local_9c8);
  local_9f8._32_6_ = SUB86(local_6e0,0);
  local_9f8.elementSize = (ElementSize)((ulong)local_6e0 >> 0x30);
  local_9f8._39_1_ = SUB81((ulong)local_6e0 >> 0x38,0);
  local_9f8.nestingLimit = iStack_6d8;
  local_9f8._44_4_ = uStack_6d4;
  local_9f8.ptr = local_6f0;
  local_9f8.elementCount = (ListElementCount)uStack_6e8;
  local_9f8.step._0_2_ = (undefined2)((ulong)uStack_6e8 >> 0x20);
  local_9f8.step._2_1_ = (undefined1)((ulong)uStack_6e8 >> 0x30);
  local_9f8.step._3_1_ = (undefined1)((ulong)uStack_6e8 >> 0x38);
  local_9f8.segment = local_700;
  local_9f8.capTable = pCStack_6f8;
  local_998.pointer = local_a28.pointers + 4;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9c8.ptr = (byte *)0x0;
  local_9c8._24_6_ = 0;
  local_9c8.segment = (SegmentBuilder *)0x0;
  local_9c8.capTable = (CapTableBuilder *)0x0;
  local_9c8.step._2_1_ = 0;
  local_9c8.step._3_1_ = 0;
  local_9c8.structDataSize = 0;
  local_9c8.structPointerCount = 0;
  local_9c8.elementSize = BYTE;
  ListBuilder::asReader(&local_9c8);
  local_9f8._32_6_ = SUB86(local_710,0);
  local_9f8.elementSize = (ElementSize)((ulong)local_710 >> 0x30);
  local_9f8._39_1_ = SUB81((ulong)local_710 >> 0x38,0);
  local_9f8.nestingLimit = iStack_708;
  local_9f8._44_4_ = uStack_704;
  local_9f8.ptr = local_720;
  local_9f8.elementCount = (ListElementCount)uStack_718;
  local_9f8.step._0_2_ = (undefined2)((ulong)uStack_718 >> 0x20);
  local_9f8.step._2_1_ = (undefined1)((ulong)uStack_718 >> 0x30);
  local_9f8.step._3_1_ = (undefined1)((ulong)uStack_718 >> 0x38);
  local_9f8.segment = local_730;
  local_9f8.capTable = pCStack_728;
  local_998.pointer = local_a28.pointers + 9;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9c8.ptr = (byte *)0x0;
  local_9c8._24_6_ = 0;
  local_9c8.segment = (SegmentBuilder *)0x0;
  local_9c8.capTable = (CapTableBuilder *)0x0;
  local_9c8.step._2_1_ = 0;
  local_9c8.step._3_1_ = 0;
  local_9c8.structDataSize = 0;
  local_9c8.structPointerCount = 0;
  local_9c8.elementSize = TWO_BYTES;
  ListBuilder::asReader(&local_9c8);
  local_9f8._32_6_ = SUB86(local_740,0);
  local_9f8.elementSize = (ElementSize)((ulong)local_740 >> 0x30);
  local_9f8._39_1_ = SUB81((ulong)local_740 >> 0x38,0);
  local_9f8.nestingLimit = iStack_738;
  local_9f8._44_4_ = uStack_734;
  local_9f8.ptr = local_750;
  local_9f8.elementCount = (ListElementCount)uStack_748;
  local_9f8.step._0_2_ = (undefined2)((ulong)uStack_748 >> 0x20);
  local_9f8.step._2_1_ = (undefined1)((ulong)uStack_748 >> 0x30);
  local_9f8.step._3_1_ = (undefined1)((ulong)uStack_748 >> 0x38);
  local_9f8.segment = local_760;
  local_9f8.capTable = pCStack_758;
  local_998.pointer = local_a28.pointers + 10;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9c8.ptr = (byte *)0x0;
  local_9c8._24_6_ = 0;
  local_9c8.segment = (SegmentBuilder *)0x0;
  local_9c8.capTable = (CapTableBuilder *)0x0;
  local_9c8.step._2_1_ = 0;
  local_9c8.step._3_1_ = 0;
  local_9c8.structDataSize = 0;
  local_9c8.structPointerCount = 0;
  local_9c8.elementSize = FOUR_BYTES;
  ListBuilder::asReader(&local_9c8);
  local_9f8._32_6_ = SUB86(local_770,0);
  local_9f8.elementSize = (ElementSize)((ulong)local_770 >> 0x30);
  local_9f8._39_1_ = SUB81((ulong)local_770 >> 0x38,0);
  local_9f8.nestingLimit = iStack_768;
  local_9f8._44_4_ = uStack_764;
  local_9f8.ptr = local_780;
  local_9f8.elementCount = (ListElementCount)uStack_778;
  local_9f8.step._0_2_ = (undefined2)((ulong)uStack_778 >> 0x20);
  local_9f8.step._2_1_ = (undefined1)((ulong)uStack_778 >> 0x30);
  local_9f8.step._3_1_ = (undefined1)((ulong)uStack_778 >> 0x38);
  local_9f8.segment = local_790;
  local_9f8.capTable = pCStack_788;
  local_998.pointer = local_a28.pointers + 0xb;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9c8.ptr = (byte *)0x0;
  local_9c8._24_6_ = 0;
  local_9c8.segment = (SegmentBuilder *)0x0;
  local_9c8.capTable = (CapTableBuilder *)0x0;
  local_9c8.step._2_1_ = 0;
  local_9c8.step._3_1_ = 0;
  local_9c8.structDataSize = 0;
  local_9c8.structPointerCount = 0;
  local_9c8.elementSize = EIGHT_BYTES;
  ListBuilder::asReader(&local_9c8);
  local_9f8._32_6_ = SUB86(local_7a0,0);
  local_9f8.elementSize = (ElementSize)((ulong)local_7a0 >> 0x30);
  local_9f8._39_1_ = SUB81((ulong)local_7a0 >> 0x38,0);
  local_9f8.nestingLimit = iStack_798;
  local_9f8._44_4_ = uStack_794;
  local_9f8.ptr = local_7b0;
  local_9f8.elementCount = (ListElementCount)uStack_7a8;
  local_9f8.step._0_2_ = (undefined2)((ulong)uStack_7a8 >> 0x20);
  local_9f8.step._2_1_ = (undefined1)((ulong)uStack_7a8 >> 0x30);
  local_9f8.step._3_1_ = (undefined1)((ulong)uStack_7a8 >> 0x38);
  local_9f8.segment = local_7c0;
  local_9f8.capTable = pCStack_7b8;
  local_998.pointer = local_a28.pointers + 0xc;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9c8.ptr = (byte *)0x0;
  local_9c8._24_6_ = 0;
  local_9c8.segment = (SegmentBuilder *)0x0;
  local_9c8.capTable = (CapTableBuilder *)0x0;
  local_9c8.step._2_1_ = 0;
  local_9c8.step._3_1_ = 0;
  local_9c8.structDataSize = 0;
  local_9c8.structPointerCount = 0;
  local_9c8.elementSize = BYTE;
  ListBuilder::asReader(&local_9c8);
  local_9f8._32_6_ = SUB86(local_7d0,0);
  local_9f8.elementSize = (ElementSize)((ulong)local_7d0 >> 0x30);
  local_9f8._39_1_ = SUB81((ulong)local_7d0 >> 0x38,0);
  local_9f8.nestingLimit = iStack_7c8;
  local_9f8._44_4_ = uStack_7c4;
  local_9f8.ptr = local_7e0;
  local_9f8.elementCount = (ListElementCount)uStack_7d8;
  local_9f8.step._0_2_ = (undefined2)((ulong)uStack_7d8 >> 0x20);
  local_9f8.step._2_1_ = (undefined1)((ulong)uStack_7d8 >> 0x30);
  local_9f8.step._3_1_ = (undefined1)((ulong)uStack_7d8 >> 0x38);
  local_9f8.segment = local_7f0;
  local_9f8.capTable = pCStack_7e8;
  local_998.pointer = local_a28.pointers + 5;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9c8.ptr = (byte *)0x0;
  local_9c8._24_6_ = 0;
  local_9c8.segment = (SegmentBuilder *)0x0;
  local_9c8.capTable = (CapTableBuilder *)0x0;
  local_9c8.step._2_1_ = 0;
  local_9c8.step._3_1_ = 0;
  local_9c8.structDataSize = 0;
  local_9c8.structPointerCount = 0;
  local_9c8.elementSize = TWO_BYTES;
  ListBuilder::asReader(&local_9c8);
  local_9f8._32_6_ = SUB86(local_800,0);
  local_9f8.elementSize = (ElementSize)((ulong)local_800 >> 0x30);
  local_9f8._39_1_ = SUB81((ulong)local_800 >> 0x38,0);
  local_9f8.nestingLimit = iStack_7f8;
  local_9f8._44_4_ = uStack_7f4;
  local_9f8.ptr = local_810;
  local_9f8.elementCount = (ListElementCount)uStack_808;
  local_9f8.step._0_2_ = (undefined2)((ulong)uStack_808 >> 0x20);
  local_9f8.step._2_1_ = (undefined1)((ulong)uStack_808 >> 0x30);
  local_9f8.step._3_1_ = (undefined1)((ulong)uStack_808 >> 0x38);
  local_9f8.segment = local_820;
  local_9f8.capTable = pCStack_818;
  local_998.pointer = local_a28.pointers + 6;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9c8.ptr = (byte *)0x0;
  local_9c8._24_6_ = 0;
  local_9c8.segment = (SegmentBuilder *)0x0;
  local_9c8.capTable = (CapTableBuilder *)0x0;
  local_9c8.step._2_1_ = 0;
  local_9c8.step._3_1_ = 0;
  local_9c8.structDataSize = 0;
  local_9c8.structPointerCount = 0;
  local_9c8.elementSize = FOUR_BYTES;
  ListBuilder::asReader(&local_9c8);
  local_9f8._32_6_ = SUB86(local_830,0);
  local_9f8.elementSize = (ElementSize)((ulong)local_830 >> 0x30);
  local_9f8._39_1_ = SUB81((ulong)local_830 >> 0x38,0);
  local_9f8.nestingLimit = iStack_828;
  local_9f8._44_4_ = uStack_824;
  local_9f8.ptr = local_840;
  local_9f8.elementCount = (ListElementCount)uStack_838;
  local_9f8.step._0_2_ = (undefined2)((ulong)uStack_838 >> 0x20);
  local_9f8.step._2_1_ = (undefined1)((ulong)uStack_838 >> 0x30);
  local_9f8.step._3_1_ = (undefined1)((ulong)uStack_838 >> 0x38);
  local_9f8.segment = local_850;
  local_9f8.capTable = pCStack_848;
  local_998.pointer = local_a28.pointers + 7;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9c8.ptr = (byte *)0x0;
  local_9c8._24_6_ = 0;
  local_9c8.segment = (SegmentBuilder *)0x0;
  local_9c8.capTable = (CapTableBuilder *)0x0;
  local_9c8.step._2_1_ = 0;
  local_9c8.step._3_1_ = 0;
  local_9c8.structDataSize = 0;
  local_9c8.structPointerCount = 0;
  local_9c8.elementSize = EIGHT_BYTES;
  ListBuilder::asReader(&local_9c8);
  local_9f8._32_6_ = SUB86(local_860,0);
  local_9f8.elementSize = (ElementSize)((ulong)local_860 >> 0x30);
  local_9f8._39_1_ = SUB81((ulong)local_860 >> 0x38,0);
  local_9f8.nestingLimit = iStack_858;
  local_9f8._44_4_ = uStack_854;
  local_9f8.ptr = local_870;
  local_9f8.elementCount = (ListElementCount)uStack_868;
  local_9f8.step._0_2_ = (undefined2)((ulong)uStack_868 >> 0x20);
  local_9f8.step._2_1_ = (undefined1)((ulong)uStack_868 >> 0x30);
  local_9f8.step._3_1_ = (undefined1)((ulong)uStack_868 >> 0x38);
  local_9f8.segment = local_880;
  local_9f8.capTable = pCStack_878;
  local_998.pointer = local_a28.pointers + 8;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9c8.ptr = (byte *)0x0;
  local_9c8._24_6_ = 0;
  local_9c8.segment = (SegmentBuilder *)0x0;
  local_9c8.capTable = (CapTableBuilder *)0x0;
  local_9c8.step._2_1_ = 0;
  local_9c8.step._3_1_ = 0;
  local_9c8.structDataSize = 0;
  local_9c8.structPointerCount = 0;
  local_9c8.elementSize = FOUR_BYTES;
  ListBuilder::asReader(&local_9c8);
  local_9f8._32_6_ = SUB86(local_890,0);
  local_9f8.elementSize = (ElementSize)((ulong)local_890 >> 0x30);
  local_9f8._39_1_ = SUB81((ulong)local_890 >> 0x38,0);
  local_9f8.nestingLimit = iStack_888;
  local_9f8._44_4_ = uStack_884;
  local_9f8.ptr = local_8a0;
  local_9f8.elementCount = (ListElementCount)uStack_898;
  local_9f8.step._0_2_ = (undefined2)((ulong)uStack_898 >> 0x20);
  local_9f8.step._2_1_ = (undefined1)((ulong)uStack_898 >> 0x30);
  local_9f8.step._3_1_ = (undefined1)((ulong)uStack_898 >> 0x38);
  local_9f8.segment = local_8b0;
  local_9f8.capTable = pCStack_8a8;
  local_998.pointer = local_a28.pointers + 0xd;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9c8.ptr = (byte *)0x0;
  local_9c8._24_6_ = 0;
  local_9c8.segment = (SegmentBuilder *)0x0;
  local_9c8.capTable = (CapTableBuilder *)0x0;
  local_9c8.step._2_1_ = 0;
  local_9c8.step._3_1_ = 0;
  local_9c8.structDataSize = 0;
  local_9c8.structPointerCount = 0;
  local_9c8.elementSize = EIGHT_BYTES;
  ListBuilder::asReader(&local_9c8);
  local_9f8._32_6_ = SUB86(local_8c0,0);
  local_9f8.elementSize = (ElementSize)((ulong)local_8c0 >> 0x30);
  local_9f8._39_1_ = SUB81((ulong)local_8c0 >> 0x38,0);
  local_9f8.nestingLimit = iStack_8b8;
  local_9f8._44_4_ = uStack_8b4;
  local_9f8.ptr = local_8d0;
  local_9f8.elementCount = (ListElementCount)uStack_8c8;
  local_9f8.step._0_2_ = (undefined2)((ulong)uStack_8c8 >> 0x20);
  local_9f8.step._2_1_ = (undefined1)((ulong)uStack_8c8 >> 0x30);
  local_9f8.step._3_1_ = (undefined1)((ulong)uStack_8c8 >> 0x38);
  local_9f8.segment = local_8e0;
  local_9f8.capTable = pCStack_8d8;
  local_998.pointer = local_a28.pointers + 0xe;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9c8.ptr = (byte *)0x0;
  local_9c8._24_6_ = 0;
  local_9c8.segment = (SegmentBuilder *)0x0;
  local_9c8.capTable = (CapTableBuilder *)0x0;
  local_9c8.step._2_1_ = 0;
  local_9c8.step._3_1_ = 0;
  local_9c8.structDataSize = 0;
  local_9c8.structPointerCount = 0;
  local_9c8.elementSize = POINTER;
  ListBuilder::asReader(&local_9c8);
  local_9f8._32_6_ = SUB86(local_8f0,0);
  local_9f8.elementSize = (ElementSize)((ulong)local_8f0 >> 0x30);
  local_9f8._39_1_ = SUB81((ulong)local_8f0 >> 0x38,0);
  local_9f8.nestingLimit = iStack_8e8;
  local_9f8._44_4_ = uStack_8e4;
  local_9f8.ptr = local_900;
  local_9f8.elementCount = (ListElementCount)uStack_8f8;
  local_9f8.step._0_2_ = (undefined2)((ulong)uStack_8f8 >> 0x20);
  local_9f8.step._2_1_ = (undefined1)((ulong)uStack_8f8 >> 0x30);
  local_9f8.step._3_1_ = (undefined1)((ulong)uStack_8f8 >> 0x38);
  local_9f8.segment = local_910;
  local_9f8.capTable = pCStack_908;
  local_998.pointer = local_a28.pointers + 0xf;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9c8.ptr = (byte *)0x0;
  local_9c8._24_6_ = 0;
  local_9c8.segment = (SegmentBuilder *)0x0;
  local_9c8.capTable = (CapTableBuilder *)0x0;
  local_9c8.step._2_1_ = 0;
  local_9c8.step._3_1_ = 0;
  local_9c8.structDataSize = 0;
  local_9c8.structPointerCount = 0;
  local_9c8.elementSize = POINTER;
  ListBuilder::asReader(&local_9c8);
  local_9f8._32_6_ = SUB86(local_920,0);
  local_9f8.elementSize = (ElementSize)((ulong)local_920 >> 0x30);
  local_9f8._39_1_ = SUB81((ulong)local_920 >> 0x38,0);
  local_9f8.nestingLimit = iStack_918;
  local_9f8._44_4_ = uStack_914;
  local_9f8.ptr = local_930;
  local_9f8.elementCount = (ListElementCount)uStack_928;
  local_9f8.step._0_2_ = (undefined2)((ulong)uStack_928 >> 0x20);
  local_9f8.step._2_1_ = (undefined1)((ulong)uStack_928 >> 0x30);
  local_9f8.step._3_1_ = (undefined1)((ulong)uStack_928 >> 0x38);
  local_9f8.segment = local_940;
  local_9f8.capTable = pCStack_938;
  local_998.pointer = local_a28.pointers + 0x10;
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9c8.ptr = (byte *)0x0;
  local_9c8._24_6_ = 0;
  local_9c8.segment = (SegmentBuilder *)0x0;
  local_9c8.capTable = (CapTableBuilder *)0x0;
  local_9c8.step._2_1_ = 0;
  local_9c8.step._3_1_ = 0;
  local_9c8.structDataSize = 0;
  local_9c8.structPointerCount = 0;
  local_9c8.elementSize = INLINE_COMPOSITE;
  ListBuilder::asReader(&local_9c8);
  local_9f8._32_6_ = SUB86(local_950,0);
  local_9f8.elementSize = (ElementSize)((ulong)local_950 >> 0x30);
  local_9f8._39_1_ = SUB81((ulong)local_950 >> 0x38,0);
  local_9f8.nestingLimit = iStack_948;
  local_9f8._44_4_ = uStack_944;
  local_9f8.ptr = local_960;
  local_9f8.elementCount = (ListElementCount)uStack_958;
  local_9f8.step._0_2_ = (undefined2)((ulong)uStack_958 >> 0x20);
  local_9f8.step._2_1_ = (undefined1)((ulong)uStack_958 >> 0x30);
  local_9f8.step._3_1_ = (undefined1)((ulong)uStack_958 >> 0x38);
  local_9f8.segment = local_970;
  local_9f8.capTable = pCStack_968;
  local_998.pointer = local_a28.pointers + 0x11;
  local_998.segment = (SegmentBuilder *)CONCAT44(local_a28.segment._4_4_,local_a28.segment._0_4_);
  PointerBuilder::setList(&local_998,&local_9f8,false);
  local_9f8.ptr = (byte *)(local_a28.pointers + 3);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasVoidList()\"",
               (char (*) [36])"failed: expected root.hasVoidList()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 3);
  PointerBuilder::getList((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,VOID,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 3);
    PointerBuilder::getList((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,VOID,(word *)0x0)
    ;
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getVoidList().size())\", 0, root.getVoidList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getVoidList().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 4);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasBoolList()\"",
               (char (*) [36])"failed: expected root.hasBoolList()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 4);
  PointerBuilder::getList((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,BIT,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 4);
    PointerBuilder::getList((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,BIT,(word *)0x0);
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getBoolList().size())\", 0, root.getBoolList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getBoolList().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 9);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasUInt8List()\"",
               (char (*) [37])"failed: expected root.hasUInt8List()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 9);
  PointerBuilder::getList((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,BYTE,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 9);
    PointerBuilder::getList((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,BYTE,(word *)0x0)
    ;
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt8List().size())\", 0, root.getUInt8List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getUInt8List().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 10);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasUInt16List()\"",
               (char (*) [38])"failed: expected root.hasUInt16List()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 10);
  PointerBuilder::getList
            ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,TWO_BYTES,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 10);
    PointerBuilder::getList
              ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,TWO_BYTES,(word *)0x0);
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt16List().size())\", 0, root.getUInt16List().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getUInt16List().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 0xb);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasUInt32List()\"",
               (char (*) [38])"failed: expected root.hasUInt32List()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 0xb);
  PointerBuilder::getList
            ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,FOUR_BYTES,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 0xb);
    PointerBuilder::getList
              ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,FOUR_BYTES,(word *)0x0);
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt32List().size())\", 0, root.getUInt32List().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getUInt32List().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 0xc);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasUInt64List()\"",
               (char (*) [38])"failed: expected root.hasUInt64List()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 0xc);
  PointerBuilder::getList
            ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,EIGHT_BYTES,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 0xc);
    PointerBuilder::getList
              ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,EIGHT_BYTES,(word *)0x0);
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt64List().size())\", 0, root.getUInt64List().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getUInt64List().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 5);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasInt8List()\"",
               (char (*) [36])"failed: expected root.hasInt8List()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 5);
  PointerBuilder::getList((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,BYTE,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 5);
    PointerBuilder::getList((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,BYTE,(word *)0x0)
    ;
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt8List().size())\", 0, root.getInt8List().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getInt8List().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 6);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasInt16List()\"",
               (char (*) [37])"failed: expected root.hasInt16List()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 6);
  PointerBuilder::getList
            ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,TWO_BYTES,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 6);
    PointerBuilder::getList
              ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,TWO_BYTES,(word *)0x0);
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt16List().size())\", 0, root.getInt16List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getInt16List().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 7);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasInt32List()\"",
               (char (*) [37])"failed: expected root.hasInt32List()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 7);
  PointerBuilder::getList
            ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,FOUR_BYTES,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 7);
    PointerBuilder::getList
              ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,FOUR_BYTES,(word *)0x0);
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt32List().size())\", 0, root.getInt32List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getInt32List().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 8);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasInt64List()\"",
               (char (*) [37])"failed: expected root.hasInt64List()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 8);
  PointerBuilder::getList
            ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,EIGHT_BYTES,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 8);
    PointerBuilder::getList
              ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,EIGHT_BYTES,(word *)0x0);
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt64List().size())\", 0, root.getInt64List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getInt64List().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 0xd);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasFloat32List()\"",
               (char (*) [39])"failed: expected root.hasFloat32List()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 0xd);
  PointerBuilder::getList
            ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,FOUR_BYTES,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 0xd);
    PointerBuilder::getList
              ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,FOUR_BYTES,(word *)0x0);
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[55],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getFloat32List().size())\", 0, root.getFloat32List().size()"
               ,(char (*) [55])"failed: expected (0) == (root.getFloat32List().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 0xe);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasFloat64List()\"",
               (char (*) [39])"failed: expected root.hasFloat64List()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 0xe);
  PointerBuilder::getList
            ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,EIGHT_BYTES,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 0xe);
    PointerBuilder::getList
              ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,EIGHT_BYTES,(word *)0x0);
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[55],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getFloat64List().size())\", 0, root.getFloat64List().size()"
               ,(char (*) [55])"failed: expected (0) == (root.getFloat64List().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 0xf);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasTextList()\"",
               (char (*) [36])"failed: expected root.hasTextList()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 0xf);
  PointerBuilder::getList
            ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,POINTER,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 0xf);
    PointerBuilder::getList
              ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,POINTER,(word *)0x0);
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getTextList().size())\", 0, root.getTextList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getTextList().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 0x10);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasDataList()\"",
               (char (*) [36])"failed: expected root.hasDataList()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 0x10);
  PointerBuilder::getList
            ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,POINTER,(word *)0x0);
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 0x10);
    PointerBuilder::getList
              ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,POINTER,(word *)0x0);
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getDataList().size())\", 0, root.getDataList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getDataList().size())",
               (int *)&local_998,&local_a2c);
  }
  local_9f8.ptr = (byte *)(local_a28.pointers + 0x11);
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasStructList()\"",
               (char (*) [38])"failed: expected root.hasStructList()");
  }
  local_9c8.ptr = (byte *)(local_a28.pointers + 0x11);
  PointerBuilder::getStructList
            ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,(StructSize)0x140006,(word *)0x0
            );
  if ((local_9f8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    local_9c8.ptr = (byte *)(local_a28.pointers + 0x11);
    PointerBuilder::getStructList
              ((ListBuilder *)&local_9f8,(PointerBuilder *)&local_9c8,(StructSize)0x140006,
               (word *)0x0);
    local_a2c = local_9f8.elementCount;
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getStructList().size())\", 0, root.getStructList().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getStructList().size())",
               (int *)&local_998,&local_a2c);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_100);
  return;
}

Assistant:

TEST(Encoding, SetListToEmpty) {
  // Test initializing list fields from various ways of constructing zero-sized lists.
  // At one point this would often fail because the lists would have ElementSize::VOID which is
  // incompatible with other list sizes.

#define ALL_LIST_TYPES(MACRO) \
  MACRO(Void, Void) \
  MACRO(Bool, bool) \
  MACRO(UInt8, uint8_t) \
  MACRO(UInt16, uint16_t) \
  MACRO(UInt32, uint32_t) \
  MACRO(UInt64, uint64_t) \
  MACRO(Int8, int8_t) \
  MACRO(Int16, int16_t) \
  MACRO(Int32, int32_t) \
  MACRO(Int64, int64_t) \
  MACRO(Float32, float) \
  MACRO(Float64, double) \
  MACRO(Text, Text) \
  MACRO(Data, Data) \
  MACRO(Struct, TestAllTypes)

#define SET_FROM_READER_ACCESSOR(name, type) \
  root.set##name##List(reader.get##name##List());

#define SET_FROM_BUILDER_ACCESSOR(name, type) \
  root.set##name##List(root.get##name##List());

#define SET_FROM_READER_CONSTRUCTOR(name, type) \
  root.set##name##List(List<type>::Reader());

#define SET_FROM_BUILDER_CONSTRUCTOR(name, type) \
  root.set##name##List(List<type>::Builder());

#define CHECK_EMPTY_NONNULL(name, type) \
  EXPECT_TRUE(root.has##name##List()); \
  EXPECT_EQ(0, root.get##name##List().size());

  {
    MallocMessageBuilder builder;
    auto root = builder.initRoot<test::TestAllTypes>();
    auto reader = root.asReader();
    ALL_LIST_TYPES(SET_FROM_READER_ACCESSOR)
    ALL_LIST_TYPES(CHECK_EMPTY_NONNULL)
  }

  {
    MallocMessageBuilder builder;
    auto root = builder.initRoot<test::TestAllTypes>();
    ALL_LIST_TYPES(SET_FROM_BUILDER_ACCESSOR)
    ALL_LIST_TYPES(CHECK_EMPTY_NONNULL)
  }

  {
    MallocMessageBuilder builder;
    auto root = builder.initRoot<test::TestAllTypes>();
    ALL_LIST_TYPES(SET_FROM_READER_CONSTRUCTOR)
    ALL_LIST_TYPES(CHECK_EMPTY_NONNULL)
  }

  {
    MallocMessageBuilder builder;
    auto root = builder.initRoot<test::TestAllTypes>();
    ALL_LIST_TYPES(SET_FROM_BUILDER_CONSTRUCTOR)
    ALL_LIST_TYPES(CHECK_EMPTY_NONNULL)
  }

#undef SET_FROM_READER_ACCESSOR
#undef SET_FROM_BUILDER_ACCESSOR
#undef SET_FROM_READER_CONSTRUCTOR
#undef SET_FROM_BUILDER_CONSTRUCTOR
#undef CHECK_EMPTY_NONNULL
}